

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

void crash_recovery_test(bool walflush)

{
  fdb_encryption_key *__s;
  void *pvVar1;
  long lVar2;
  void *pvVar3;
  undefined8 doc;
  hbtrie **pphVar4;
  fdb_status fVar5;
  int iVar6;
  fdb_status fVar7;
  fdb_file_handle **ptr_fhandle;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  fdb_doc *fconfig_00;
  fdb_kvs_config *config;
  fdb_config *pfVar11;
  fdb_kvs_handle *pfVar12;
  __atomic_base<unsigned_long> handle;
  __atomic_base<unsigned_long> _Var13;
  char *handle_00;
  fdb_kvs_handle *pfVar14;
  fdb_iterator *doc_00;
  fdb_kvs_handle *pfVar15;
  char *in_RCX;
  char *pcVar16;
  fdb_kvs_handle *extraout_RDX;
  fdb_kvs_handle *pfVar17;
  long lVar18;
  hbtrie **seqnum;
  fdb_kvs_handle *doc_01;
  uint uVar19;
  size_t unaff_RBP;
  fdb_doc *__s_00;
  long lVar20;
  char *pcVar21;
  __atomic_base<unsigned_long> _Var22;
  undefined7 in_register_00000039;
  fdb_file_handle *fhandle;
  fdb_iterator *pfVar23;
  fdb_kvs_handle *unaff_R12;
  char *unaff_R13;
  ulong uVar24;
  fdb_doc *pfVar25;
  fdb_doc **ppfVar26;
  fdb_doc *pfVar27;
  char *pcVar28;
  fdb_iterator *config_00;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_doc *rdoc;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_file_info file_info;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_doc *pfStack_2b70;
  fdb_iterator *pfStack_2b68;
  int iStack_2b5c;
  fdb_kvs_handle *pfStack_2b58;
  timeval tStack_2b50;
  fdb_kvs_handle *pfStack_2b40;
  fdb_kvs_handle *pfStack_2b38;
  fdb_kvs_handle *pfStack_2b30;
  fdb_kvs_handle *pfStack_2b28;
  fdb_iterator *pfStack_2b20;
  fdb_iterator *pfStack_2b18;
  fdb_kvs_handle *pfStack_2b08;
  fdb_kvs_handle *pfStack_2b00;
  undefined1 auStack_2af8 [24];
  fdb_kvs_handle *pfStack_2ae0;
  fdb_kvs_handle *pfStack_2ad8;
  fdb_kvs_handle *pfStack_2ad0;
  fdb_kvs_handle *pfStack_2ac8;
  undefined1 auStack_2ac0 [80];
  undefined8 auStack_2a70 [5];
  fdb_doc *apfStack_2a48 [6];
  fdb_kvs_info fStack_2a18;
  timeval tStack_29e8;
  undefined1 auStack_29d8 [280];
  fdb_iterator fStack_28c0;
  fdb_kvs_handle fStack_27c0;
  fdb_kvs_handle *pfStack_25b8;
  fdb_kvs_handle *pfStack_25b0;
  fdb_kvs_handle *pfStack_25a8;
  code *pcStack_25a0;
  fdb_kvs_handle *pfStack_2590;
  fdb_iterator *pfStack_2588;
  fdb_kvs_handle *pfStack_2580;
  fdb_kvs_handle *pfStack_2578;
  fdb_custom_cmp_variable *pp_Stack_2570;
  size_t sStack_2568;
  fdb_kvs_handle *pfStack_2560;
  fdb_kvs_info fStack_2558;
  undefined1 auStack_2528 [10];
  undefined1 auStack_251e [14];
  undefined2 uStack_2510;
  fdb_encryption_key afStack_2418 [7];
  fdb_kvs_handle *pfStack_2310;
  fdb_kvs_handle *pfStack_2308;
  fdb_kvs_handle *pfStack_2300;
  fdb_kvs_handle *pfStack_22f8;
  fdb_kvs_handle *pfStack_22f0;
  fdb_kvs_handle *pfStack_22e8;
  undefined1 auStack_22d8 [8];
  fdb_file_handle *pfStack_22d0;
  fdb_kvs_handle *pfStack_22c8;
  fdb_kvs_handle *pfStack_22c0;
  fdb_iterator *pfStack_22b8;
  undefined1 auStack_22b0 [48];
  undefined1 auStack_2280 [64];
  hbtrie *phStack_2240;
  kvs_ops_stat *pkStack_2238;
  timeval tStack_2210;
  btreeblk_handle *apbStack_2200 [33];
  undefined1 auStack_20f8 [32];
  undefined2 uStack_20d8;
  undefined1 uStack_20b8;
  code *pcStack_20a0;
  undefined4 uStack_2098;
  fdb_txn *pfStack_2090;
  fdb_kvs_handle *pfStack_2000;
  char acStack_1ff8 [256];
  fdb_kvs_handle *pfStack_1ef8;
  fdb_kvs_handle *pfStack_1ef0;
  fdb_kvs_handle *pfStack_1ee8;
  fdb_kvs_handle *pfStack_1ee0;
  fdb_kvs_handle *pfStack_1ed8;
  fdb_kvs_handle *pfStack_1ed0;
  fdb_kvs_handle *pfStack_1ec0;
  uint uStack_1eb4;
  fdb_iterator *pfStack_1eb0;
  fdb_kvs_handle *pfStack_1ea8;
  undefined4 *puStack_1ea0;
  fdb_kvs_handle *pfStack_1e98;
  fdb_kvs_handle *pfStack_1e90;
  fdb_iterator *pfStack_1e88;
  fdb_file_handle *pfStack_1e80;
  fdb_iterator *pfStack_1e78;
  size_t sStack_1e70;
  undefined1 auStack_1e68 [32];
  timeval tStack_1e48;
  undefined1 auStack_1e38 [272];
  size_t sStack_1d28;
  char *pcStack_1d20;
  uint8_t uStack_1d18;
  undefined2 uStack_1d10;
  undefined1 uStack_1cf0;
  fdb_kvs_handle *pfStack_1c38;
  char acStack_1c30 [256];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_1b30;
  fdb_kvs_handle *pfStack_1b28;
  fdb_kvs_handle *pfStack_1b20;
  fdb_kvs_handle *pfStack_1b18;
  fdb_kvs_handle *pfStack_1b10;
  fdb_kvs_handle *pfStack_1b08;
  fdb_kvs_handle *pfStack_1af8;
  fdb_file_handle *pfStack_1af0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1ae8;
  fdb_doc *pfStack_1ae0;
  fdb_kvs_handle *pfStack_1ad8;
  fdb_kvs_handle *pfStack_1ad0;
  fdb_kvs_handle *pfStack_1ac8;
  fdb_kvs_handle *pfStack_1ac0;
  fdb_kvs_handle *pfStack_1ab8;
  fdb_kvs_handle *pfStack_1ab0;
  fdb_kvs_config fStack_1aa8;
  fdb_kvs_config fStack_1a90;
  fdb_kvs_config fStack_1a70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1a50 [4];
  timeval tStack_1a30;
  fdb_config fStack_1a20;
  fdb_kvs_info *pfStack_1908;
  atomic<unsigned_long> aStack_1900;
  fdb_kvs_handle *pfStack_18f8;
  atomic<unsigned_long> aStack_18f0;
  fdb_kvs_handle *pfStack_18e8;
  atomic<unsigned_long> aStack_18e0;
  fdb_kvs_handle *pfStack_18d0;
  fdb_kvs_handle *pfStack_18c8;
  fdb_file_handle *pfStack_18c0;
  undefined1 auStack_18b8 [16];
  fdb_config *pfStack_18a8;
  fdb_kvs_info fStack_18a0;
  fdb_kvs_config fStack_1870;
  undefined1 auStack_1858 [176];
  char acStack_17a8 [256];
  undefined1 auStack_16a8 [512];
  fdb_config fStack_14a8;
  fdb_kvs_handle *pfStack_13b0;
  fdb_kvs_handle *pfStack_13a8;
  fdb_kvs_handle *pfStack_13a0;
  fdb_kvs_handle *pfStack_1398;
  fdb_kvs_handle *pfStack_1390;
  fdb_kvs_handle *pfStack_1388;
  fdb_kvs_handle *pfStack_1380;
  fdb_kvs_handle *pfStack_1378;
  fdb_kvs_handle *pfStack_1370;
  fdb_kvs_handle *pfStack_1368;
  fdb_file_handle *pfStack_1360;
  undefined4 *puStack_1358;
  undefined1 auStack_1350 [48];
  fdb_kvs_handle *pfStack_1320;
  undefined1 auStack_1318 [40];
  undefined1 auStack_12f0 [272];
  size_t sStack_11e0;
  uint8_t uStack_11d0;
  undefined1 uStack_11c8;
  undefined1 uStack_11a8;
  fdb_kvs_handle *pfStack_10f0;
  char acStack_10e8 [256];
  hbtrie **pphStack_fe8;
  fdb_kvs_handle *pfStack_fe0;
  fdb_kvs_handle *pfStack_fd8;
  fdb_config *pfStack_fd0;
  fdb_kvs_handle *pfStack_fc8;
  fdb_kvs_handle *pfStack_fc0;
  fdb_kvs_handle *pfStack_fa8;
  hbtrie *phStack_fa0;
  undefined1 auStack_f98 [16];
  hbtrie **pphStack_f88;
  kvs_info *apkStack_f80 [3];
  hbtrie *phStack_f68;
  timeval tStack_f60;
  undefined1 auStack_f50 [184];
  char acStack_e98 [256];
  undefined1 auStack_d98 [520];
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined4 uStack_b74;
  undefined1 uStack_b69;
  fdb_doc *pfStack_aa0;
  fdb_kvs_handle *pfStack_a98;
  fdb_kvs_handle *pfStack_a90;
  fdb_doc *pfStack_a88;
  fdb_kvs_config *pfStack_a80;
  fdb_doc *pfStack_a78;
  fdb_kvs_handle *pfStack_a68;
  undefined1 auStack_a60 [16];
  fdb_kvs_handle *pfStack_a50;
  undefined1 auStack_a48 [24];
  fdb_doc *pfStack_a30;
  undefined1 auStack_a08 [64];
  fdb_doc *apfStack_9c8 [4];
  fdb_doc *pfStack_9a8;
  fdb_doc *apfStack_9a0 [5];
  fdb_doc *apfStack_978 [5];
  timeval tStack_950;
  char acStack_940 [256];
  fdb_doc afStack_840 [3];
  fdb_kvs_handle fStack_740;
  fdb_kvs_handle *pfStack_538;
  fdb_doc *pfStack_530;
  fdb_file_handle **ppfStack_528;
  code *pcStack_520;
  undefined1 local_510 [28];
  undefined4 local_4f4;
  undefined1 local_4f0 [104];
  timeval local_488;
  fdb_file_info local_478;
  fdb_config local_430;
  char local_338 [256];
  fdb_kvs_handle local_238;
  
  local_4f4 = (undefined4)CONCAT71(in_register_00000039,walflush);
  pcStack_520 = (code *)0x110260;
  gettimeofday(&local_488,(__timezone_ptr_t)0x0);
  pcStack_520 = (code *)0x110265;
  memleak_start();
  pcStack_520 = (code *)0x110271;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_520 = (code *)0x110281;
  fdb_get_default_config();
  pfVar25 = (fdb_doc *)local_4f0;
  pcStack_520 = (code *)0x11028e;
  fdb_get_default_kvs_config();
  local_430.buffercache_size = 0;
  local_430.seqtree_opt = '\x01';
  local_430.wal_threshold = 0x400;
  local_430.flags = 1;
  local_430.compaction_threshold = '\0';
  ptr_fhandle = (fdb_file_handle **)(local_510 + 8);
  pcStack_520 = (code *)0x1102c4;
  fdb_open(ptr_fhandle,"./mvcc_test2",&local_430);
  pfVar17 = (fdb_kvs_handle *)local_510;
  pcStack_520 = (code *)0x1102d7;
  fdb_kvs_open_default
            ((fdb_file_handle *)local_510._8_8_,(fdb_kvs_handle **)pfVar17,(fdb_kvs_config *)pfVar25
            );
  pcStack_520 = (code *)0x1102ed;
  fVar5 = fdb_set_log_callback
                    ((fdb_kvs_handle *)local_510._0_8_,logCallbackFunc,"crash_recovery_test");
  if (fVar5 == FDB_RESULT_SUCCESS) {
    unaff_R13 = (char *)0x0;
    uVar24 = 0;
    do {
      __s = &local_238.config.encryption_key;
      pcStack_520 = (code *)0x110317;
      sprintf((char *)__s,"key%d",uVar24 & 0xffffffff);
      pcStack_520 = (code *)0x110330;
      sprintf((char *)&local_238,"meta%d",uVar24 & 0xffffffff);
      pcStack_520 = (code *)0x110349;
      sprintf(local_338,"body%d",uVar24 & 0xffffffff);
      unaff_R12 = (fdb_kvs_handle *)(local_4f0 + (long)unaff_R13 + 0x18);
      pcStack_520 = (code *)0x110359;
      unaff_RBP = strlen((char *)__s);
      pfVar17 = &local_238;
      pcStack_520 = (code *)0x11036c;
      ptr_fhandle = (fdb_file_handle **)strlen((char *)pfVar17);
      pcStack_520 = (code *)0x11037c;
      sVar8 = strlen(local_338);
      pcStack_520 = (code *)0x1103a1;
      in_RCX = (char *)pfVar17;
      fdb_doc_create((fdb_doc **)unaff_R12,&local_238.config.encryption_key,unaff_RBP,pfVar17,
                     (size_t)ptr_fhandle,local_338,sVar8);
      pcStack_520 = (code *)0x1103b0;
      fdb_set((fdb_kvs_handle *)local_510._0_8_,*(fdb_doc **)(local_4f0 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      unaff_R13 = (char *)((long)unaff_R13 + 8);
    } while (uVar24 != 10);
    pfVar25 = (fdb_doc *)0xa;
    fhandle = (fdb_file_handle *)local_510._8_8_;
    if ((char)local_4f4 != '\0') {
      pcStack_520 = (code *)0x1103d7;
      fVar5 = fdb_commit((fdb_file_handle *)local_510._8_8_,'\x01');
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pcStack_520 = (code *)0x1103e0;
        crash_recovery_test();
        goto LAB_001103e0;
      }
LAB_001103ef:
      pcStack_520 = (code *)0x110401;
      fVar5 = fdb_get_file_info((fdb_file_handle *)local_510._8_8_,&local_478);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110675;
      uVar24 = (ulong)local_430.blocksize;
      pcStack_520 = (code *)0x11042a;
      fdb_kvs_close((fdb_kvs_handle *)local_510._0_8_);
      pcStack_520 = (code *)0x110434;
      fdb_close((fdb_file_handle *)local_510._8_8_);
      pcStack_520 = (code *)0x110439;
      fdb_shutdown();
      pfVar17 = (fdb_kvs_handle *)((local_478.file_size / uVar24) * (ulong)local_430.blocksize);
      in_RCX = (char *)(ulong)(local_430.blocksize >> 2);
      pcStack_520 = (code *)0x11045b;
      iVar6 = _disk_dump("./mvcc_test2",(size_t)pfVar17,
                         (ulong)((local_430.blocksize >> 2) + local_430.blocksize * 2));
      if (iVar6 < 0) goto LAB_0011067a;
      pcStack_520 = (code *)0x11047c;
      fVar5 = fdb_open((fdb_file_handle **)(local_510 + 8),"./mvcc_test2",&local_430);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011067f;
      pcStack_520 = (code *)0x110498;
      fVar5 = fdb_kvs_open_default
                        ((fdb_file_handle *)local_510._8_8_,(fdb_kvs_handle **)local_510,
                         (fdb_kvs_config *)local_4f0);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00110684;
      pcStack_520 = (code *)0x1104b8;
      fVar5 = fdb_set_log_callback
                        ((fdb_kvs_handle *)local_510._0_8_,logCallbackFunc,"crash_recovery_test");
      if (fVar5 == FDB_RESULT_SUCCESS) {
        unaff_R13 = (char *)0x0;
        do {
          in_RCX = (char *)0x0;
          pcStack_520 = (code *)0x1104ec;
          fdb_doc_create((fdb_doc **)(local_510 + 0x10),
                         (void *)(*(size_t **)(local_4f0 + (long)unaff_R13 * 8 + 0x18))[4],
                         **(size_t **)(local_4f0 + (long)unaff_R13 * 8 + 0x18),(void *)0x0,0,
                         (void *)0x0,0);
          pcStack_520 = (code *)0x1104fb;
          fVar5 = fdb_get((fdb_kvs_handle *)local_510._0_8_,(fdb_doc *)local_510._16_8_);
          doc = local_510._16_8_;
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pcStack_520 = (code *)0x110655;
            crash_recovery_test();
LAB_00110655:
            pcStack_520 = (code *)0x110660;
            crash_recovery_test();
LAB_00110660:
            pcStack_520 = (code *)0x11066b;
            crash_recovery_test();
            goto LAB_0011066b;
          }
          ptr_fhandle = *(fdb_file_handle ***)(local_510._16_8_ + 0x38);
          unaff_RBP = *(size_t *)(local_4f0 + (long)unaff_R13 * 8 + 0x18);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x38);
          pcStack_520 = (code *)0x110524;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(local_510._16_8_ + 8));
          pfVar25 = (fdb_doc *)doc;
          if (iVar6 != 0) goto LAB_00110655;
          ptr_fhandle = *(fdb_file_handle ***)(doc + 0x40);
          unaff_R12 = *(fdb_kvs_handle **)(unaff_RBP + 0x40);
          pcStack_520 = (code *)0x110543;
          iVar6 = bcmp(ptr_fhandle,unaff_R12,*(size_t *)(doc + 0x10));
          if (iVar6 != 0) goto LAB_00110660;
          pcStack_520 = (code *)0x110553;
          fdb_doc_free((fdb_doc *)doc);
          unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
        } while (unaff_R13 != (undefined1 *)0xa);
        pfVar25 = (fdb_doc *)0x1;
        while( true ) {
          in_RCX = (char *)0x0;
          pcStack_520 = (code *)0x110587;
          fdb_doc_create((fdb_doc **)(local_510 + 0x10),(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
          *(fdb_doc **)(local_510._16_8_ + 0x28) = pfVar25;
          pcStack_520 = (code *)0x11059a;
          fVar5 = fdb_get_byseq((fdb_kvs_handle *)local_510._0_8_,(fdb_doc *)local_510._16_8_);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          pcStack_520 = (code *)0x1105ac;
          fdb_doc_free((fdb_doc *)local_510._16_8_);
          pfVar25 = (fdb_doc *)((long)&pfVar25->keylen + 1);
          if (pfVar25 == (fdb_doc *)0xb) {
            lVar18 = 0;
            do {
              pcStack_520 = (code *)0x1105c1;
              fdb_doc_free(*(fdb_doc **)(local_4f0 + lVar18 * 8 + 0x18));
              lVar18 = lVar18 + 1;
            } while (lVar18 != 10);
            pcStack_520 = (code *)0x1105d4;
            fdb_kvs_close((fdb_kvs_handle *)local_510._0_8_);
            pcStack_520 = (code *)0x1105de;
            fdb_close((fdb_file_handle *)local_510._8_8_);
            pcStack_520 = (code *)0x1105e3;
            fdb_shutdown();
            pcStack_520 = (code *)0x1105e8;
            memleak_end();
            if ((char)local_4f4 == '\0') {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar21 = "%s PASSED\n";
              }
              else {
                pcVar21 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - normal flush";
            }
            else {
              if ((crash_recovery_test(bool)::__test_pass & 1) == 0) {
                pcVar21 = "%s PASSED\n";
              }
              else {
                pcVar21 = "%s FAILED\n";
              }
              pcVar16 = "crash recovery test - walflush";
            }
            pcStack_520 = (code *)0x11063e;
            fprintf(_stderr,pcVar21,pcVar16);
            return;
          }
        }
LAB_0011066b:
        pfVar17 = (fdb_kvs_handle *)(local_510 + 0x10);
        pcStack_520 = (code *)0x110670;
        crash_recovery_test();
        goto LAB_00110670;
      }
      goto LAB_00110689;
    }
LAB_001103e0:
    pcStack_520 = (code *)0x1103e7;
    fVar5 = fdb_commit(fhandle,'\0');
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_001103ef;
  }
  else {
LAB_00110670:
    pcStack_520 = (code *)0x110675;
    crash_recovery_test();
LAB_00110675:
    pcStack_520 = (code *)0x11067a;
    crash_recovery_test();
LAB_0011067a:
    pcStack_520 = (code *)0x11067f;
    crash_recovery_test();
LAB_0011067f:
    pcStack_520 = (code *)0x110684;
    crash_recovery_test();
LAB_00110684:
    pcStack_520 = (code *)0x110689;
    crash_recovery_test();
LAB_00110689:
    pcStack_520 = (code *)0x11068e;
    crash_recovery_test();
  }
  pcStack_520 = snapshot_test;
  crash_recovery_test();
  pcVar21 = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x1106b6;
  fStack_740.bub_ctx.space_used = (uint64_t)pfVar17;
  fStack_740.bub_ctx.handle = unaff_R12;
  pfStack_538 = (fdb_kvs_handle *)unaff_R13;
  pfStack_530 = pfVar25;
  ppfStack_528 = ptr_fhandle;
  pcStack_520 = (code *)unaff_RBP;
  gettimeofday((timeval *)(apfStack_978 + 5),(__timezone_ptr_t)0x0);
  pfStack_a78 = (fdb_doc *)0x1106bb;
  memleak_start();
  auStack_a48._0_8_ = (fdb_doc *)0x0;
  pfStack_a78 = (fdb_doc *)0x1106cf;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00 = (fdb_doc *)&fStack_740.config.encryption_key;
  pfStack_a78 = (fdb_doc *)0x1106df;
  fdb_get_default_config();
  config = (fdb_kvs_config *)auStack_a08;
  pfStack_a78 = (fdb_doc *)0x1106ec;
  fdb_get_default_kvs_config();
  fStack_740.config.encryption_key.bytes[4] = '\0';
  fStack_740.config.encryption_key.bytes[5] = '\0';
  fStack_740.config.encryption_key.bytes[6] = '\0';
  fStack_740.config.encryption_key.bytes[7] = '\0';
  fStack_740.config.encryption_key.bytes[8] = '\0';
  fStack_740.config.encryption_key.bytes[9] = '\0';
  fStack_740.config.encryption_key.bytes[10] = '\0';
  fStack_740.config.encryption_key.bytes[0xb] = '\0';
  fStack_740.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_740.config.encryption_key.bytes[0xc] = '\0';
  fStack_740.config.encryption_key.bytes[0xd] = '\x04';
  fStack_740.config.encryption_key.bytes[0xe] = '\0';
  fStack_740.config.encryption_key.bytes[0xf] = '\0';
  fStack_740.config.encryption_key.bytes[0x10] = '\0';
  fStack_740.config.encryption_key.bytes[0x11] = '\0';
  fStack_740.config.encryption_key.bytes[0x12] = '\0';
  fStack_740.config.encryption_key.bytes[0x13] = '\0';
  fStack_740.config._180_4_ = 1;
  fStack_740.config.block_reusing_threshold._7_1_ = 0;
  pfStack_a78 = (fdb_doc *)0x110712;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar25 = (fdb_doc *)(auStack_a60 + 8);
  pfStack_a78 = (fdb_doc *)0x110729;
  fVar5 = fdb_open((fdb_file_handle **)pfVar25,"./mvcc_test1",(fdb_config *)fconfig_00);
  __s_00 = (fdb_doc *)(ulong)(uint)fVar5;
  pfStack_a78 = (fdb_doc *)0x11073b;
  fdb_kvs_open_default((fdb_file_handle *)auStack_a60._8_8_,&pfStack_a68,config);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011112e;
  pfStack_a78 = (fdb_doc *)0x110754;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111133;
  pfStack_a78 = (fdb_doc *)0x11076b;
  fdb_get_kvs_info(pfStack_a50,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (pfStack_a30 != (fdb_doc *)0x0) {
    pfStack_a78 = (fdb_doc *)0x11077b;
    snapshot_test();
  }
  pfVar25 = (fdb_doc *)auStack_a60;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x11079e;
  fdb_iterator_init(pfStack_a50,(fdb_iterator **)pfVar25,(void *)0x0,0,(void *)0x0,0,0);
  pfStack_a78 = (fdb_doc *)0x1107ab;
  fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)auStack_a48);
  if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00111138;
  pfStack_a78 = (fdb_doc *)0x1107be;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  pfStack_a78 = (fdb_doc *)0x1107c8;
  fdb_kvs_close(pfStack_a50);
  lVar18 = 0;
  uVar24 = 0;
  do {
    pfStack_a78 = (fdb_doc *)0x1107e8;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110800;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110818;
    sprintf((char *)afStack_840,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x11082b;
    sVar8 = strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x11083e;
    sVar9 = strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x11084e;
    sVar10 = strlen((char *)afStack_840);
    pfStack_a78 = (fdb_doc *)0x110873;
    fdb_doc_create((fdb_doc **)(auStack_a08 + lVar18 + 0x18),acStack_940,sVar8,&fStack_740,sVar9,
                   afStack_840,sVar10);
    pfStack_a78 = (fdb_doc *)0x110885;
    fdb_set(pfStack_a68,apfStack_9c8[uVar24 - 5]);
    uVar24 = uVar24 + 1;
    lVar18 = lVar18 + 8;
  } while (uVar24 != 5);
  pfStack_a78 = (fdb_doc *)0x1108a5;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\x01');
  uVar24 = 5;
  ppfVar26 = apfStack_9c8;
  do {
    pfStack_a78 = (fdb_doc *)0x1108cd;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x1108e8;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110903;
    sprintf((char *)afStack_840,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x11090b;
    sVar8 = strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110916;
    sVar9 = strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110921;
    sVar10 = strlen((char *)afStack_840);
    pfStack_a78 = (fdb_doc *)0x110941;
    fdb_doc_create(ppfVar26,acStack_940,sVar8,&fStack_740,sVar9,afStack_840,sVar10);
    pfStack_a78 = (fdb_doc *)0x11094e;
    fdb_set(pfStack_a68,*ppfVar26);
    uVar24 = uVar24 + 1;
    ppfVar26 = ppfVar26 + 1;
  } while (uVar24 != 9);
  pfStack_a78 = (fdb_doc *)0x11097d;
  sprintf(acStack_940,"key%d",9);
  pfStack_a78 = (fdb_doc *)0x11099b;
  sprintf((char *)&fStack_740,"meta%d",9);
  pfStack_a78 = (fdb_doc *)0x1109b9;
  sprintf((char *)afStack_840,"Body%d",9);
  pfStack_a78 = (fdb_doc *)0x1109c9;
  sVar8 = strlen(acStack_940);
  pfStack_a78 = (fdb_doc *)0x1109d4;
  sVar9 = strlen((char *)&fStack_740);
  pfStack_a78 = (fdb_doc *)0x1109df;
  sVar10 = strlen((char *)afStack_840);
  pfStack_a78 = (fdb_doc *)0x1109fa;
  fdb_doc_create(&pfStack_9a8,acStack_940,sVar8,&fStack_740,sVar9,afStack_840,sVar10);
  pfStack_a78 = (fdb_doc *)0x110a08;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110a14;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  *(undefined1 *)pfStack_9a8->body = 0x62;
  pfStack_a78 = (fdb_doc *)0x110a2d;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110a39;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  auStack_a48._8_8_ = pfStack_9a8->seqnum;
  pfStack_a78 = (fdb_doc *)0x110a50;
  fdb_set(pfStack_a68,pfStack_9a8);
  pfStack_a78 = (fdb_doc *)0x110a5c;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  uVar24 = 10;
  unaff_R13 = (char *)0x50;
  do {
    pfStack_a78 = (fdb_doc *)0x110a82;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110a9d;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    __s_00 = afStack_840;
    pfStack_a78 = (fdb_doc *)0x110ab8;
    sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
    pcVar21 = auStack_a08 + (long)unaff_R13 + 0x18;
    pfStack_a78 = (fdb_doc *)0x110acb;
    fconfig_00 = (fdb_doc *)strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110ad6;
    config = (fdb_kvs_config *)strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110ae1;
    sVar8 = strlen((char *)__s_00);
    in_RCX = (char *)&fStack_740;
    pfStack_a78 = (fdb_doc *)0x110b06;
    fdb_doc_create((fdb_doc **)pcVar21,acStack_940,(size_t)fconfig_00,in_RCX,(size_t)config,__s_00,
                   sVar8);
    pfStack_a78 = (fdb_doc *)0x110b18;
    fdb_set(pfStack_a68,apfStack_9c8[uVar24 - 5]);
    uVar24 = uVar24 + 1;
    unaff_R13 = (char *)((long)unaff_R13 + 8);
  } while (uVar24 != 0xf);
  pfStack_a78 = (fdb_doc *)0x110b38;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\x01');
  pfStack_a78 = (fdb_doc *)0x110b50;
  fVar5 = fdb_set_log_callback(pfStack_a68,logCallbackFunc,"snapshot_test");
  pfVar25 = (fdb_doc *)0xf;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011113d;
  pfStack_a78 = (fdb_doc *)0x110b6c;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,999999);
  fconfig_00 = (fdb_doc *)auStack_a48._8_8_;
  if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_00111142;
  pfStack_a78 = (fdb_doc *)0x110b8c;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,auStack_a48._8_8_);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111147;
  pfStack_a78 = (fdb_doc *)0x110ba6;
  fdb_get_kvs_info(pfStack_a50,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (pfStack_a30 != fconfig_00) {
    pfStack_a78 = (fdb_doc *)0x110bb9;
    snapshot_test();
  }
  uVar24 = 0xf;
  pfVar27 = (fdb_doc *)apfStack_978;
  do {
    pfStack_a78 = (fdb_doc *)0x110be1;
    sprintf(acStack_940,"key%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110bfc;
    sprintf((char *)&fStack_740,"meta%d",uVar24 & 0xffffffff);
    __s_00 = afStack_840;
    pfStack_a78 = (fdb_doc *)0x110c17;
    sprintf((char *)__s_00,"body%d",uVar24 & 0xffffffff);
    pfStack_a78 = (fdb_doc *)0x110c1f;
    config = (fdb_kvs_config *)strlen(acStack_940);
    pfStack_a78 = (fdb_doc *)0x110c2a;
    pcVar21 = (char *)strlen((char *)&fStack_740);
    pfStack_a78 = (fdb_doc *)0x110c35;
    sVar8 = strlen((char *)__s_00);
    pfStack_a78 = (fdb_doc *)0x110c55;
    fdb_doc_create((fdb_doc **)pfVar27,acStack_940,(size_t)config,&fStack_740,(size_t)pcVar21,__s_00
                   ,sVar8);
    pfStack_a78 = (fdb_doc *)0x110c62;
    fdb_set(pfStack_a68,*(fdb_doc **)pfVar27);
    uVar24 = uVar24 + 1;
    pfVar27 = (fdb_doc *)((long)pfVar27 + 8);
  } while (uVar24 != 0x14);
  unaff_R13 = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110c82;
  fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110ca2;
  fdb_iterator_init(pfStack_a50,(fdb_iterator **)auStack_a60,(void *)0x0,0,(void *)0x0,0,0);
  pfVar25 = (fdb_doc *)auStack_a48;
  do {
    pfStack_a78 = (fdb_doc *)0x110cb4;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)pfVar25);
    fconfig_00 = (fdb_doc *)auStack_a48._0_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_001110ed:
      pfStack_a78 = (fdb_doc *)0x1110f2;
      snapshot_test();
      fconfig_00 = pfVar27;
LAB_001110f2:
      pfStack_a78 = (fdb_doc *)0x1110fd;
      snapshot_test();
LAB_001110fd:
      pfStack_a78 = (fdb_doc *)0x111108;
      snapshot_test();
      goto LAB_00111108;
    }
    config = *(fdb_kvs_config **)(auStack_a48._0_8_ + 0x20);
    __s_00 = apfStack_9c8
             [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
    pcVar21 = (char *)__s_00->key;
    pfStack_a78 = (fdb_doc *)0x110cdf;
    iVar6 = bcmp(config,pcVar21,*(size_t *)auStack_a48._0_8_);
    pfVar27 = fconfig_00;
    if (iVar6 != 0) {
      pfStack_a78 = (fdb_doc *)0x1110ed;
      snapshot_test();
      goto LAB_001110ed;
    }
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
    pcVar21 = (char *)__s_00->meta;
    pfStack_a78 = (fdb_doc *)0x110cfe;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 8));
    if (iVar6 != 0) goto LAB_001110fd;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
    pcVar21 = (char *)__s_00->body;
    pfStack_a78 = (fdb_doc *)0x110d1d;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 0x10));
    if (iVar6 != 0) goto LAB_001110f2;
    pfStack_a78 = (fdb_doc *)0x110d2d;
    fdb_doc_free(fconfig_00);
    auStack_a48._0_8_ = (fdb_doc *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    pfStack_a78 = (fdb_doc *)0x110d43;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_a60._0_8_);
  } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
  if ((int)unaff_R13 != 10) goto LAB_0011114c;
  pfStack_a78 = (fdb_doc *)0x110d63;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  unaff_R13 = (char *)0x0;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110d7a;
  fdb_iterator_sequence_init(pfStack_a50,(fdb_iterator **)auStack_a60,0,0,0);
  pfVar25 = (fdb_doc *)auStack_a48;
  do {
    pfStack_a78 = (fdb_doc *)0x110d8c;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_a60._0_8_,(fdb_doc **)pfVar25);
    fconfig_00 = (fdb_doc *)auStack_a48._0_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111113;
    config = *(fdb_kvs_config **)(auStack_a48._0_8_ + 0x20);
    __s_00 = apfStack_9c8
             [(long)((long)&(((fdb_kvs_handle *)((long)unaff_R13 + -0x208))->bub_ctx).handle + 3)];
    pcVar21 = (char *)__s_00->key;
    pfStack_a78 = (fdb_doc *)0x110db7;
    iVar6 = bcmp(config,pcVar21,*(size_t *)auStack_a48._0_8_);
    if (iVar6 != 0) goto LAB_00111108;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x38);
    pcVar21 = (char *)__s_00->meta;
    pfStack_a78 = (fdb_doc *)0x110dd6;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 8));
    if (iVar6 != 0) goto LAB_00111123;
    config = *(fdb_kvs_config **)((long)fconfig_00 + 0x40);
    pcVar21 = (char *)__s_00->body;
    pfStack_a78 = (fdb_doc *)0x110df5;
    iVar6 = bcmp(config,pcVar21,*(size_t *)((long)fconfig_00 + 0x10));
    if (iVar6 != 0) goto LAB_00111118;
    pfStack_a78 = (fdb_doc *)0x110e05;
    fdb_doc_free(fconfig_00);
    auStack_a48._0_8_ = (fdb_doc *)0x0;
    unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
    pfStack_a78 = (fdb_doc *)0x110e1b;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_a60._0_8_);
    pfVar27 = fconfig_00;
  } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
  if ((int)unaff_R13 != 10) goto LAB_00111151;
  pfStack_a78 = (fdb_doc *)0x110e38;
  fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  pfStack_a78 = (fdb_doc *)0x110e42;
  fdb_kvs_close(pfStack_a68);
  pfStack_a78 = (fdb_doc *)0x110e4c;
  fdb_kvs_close(pfStack_a50);
  pfStack_a78 = (fdb_doc *)0x110e56;
  fdb_close((fdb_file_handle *)auStack_a60._8_8_);
  lVar18 = 0;
  do {
    pfStack_a78 = (fdb_doc *)0x110e65;
    fdb_doc_free(apfStack_9c8[lVar18 + -5]);
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0x14);
  pfStack_a78 = (fdb_doc *)0x110e87;
  fVar5 = fdb_open((fdb_file_handle **)(auStack_a60 + 8),"./mvcc_test2",
                   (fdb_config *)&fStack_740.config.encryption_key);
  pfVar25 = (fdb_doc *)0x14;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111156;
  in_RCX = auStack_a08;
  pfStack_a78 = (fdb_doc *)0x110eaa;
  fVar5 = fdb_kvs_open((fdb_file_handle *)auStack_a60._8_8_,&pfStack_a68,"kv2",
                       (fdb_kvs_config *)in_RCX);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011115b;
  in_RCX = "val-a";
  pfStack_a78 = (fdb_doc *)0x110ed5;
  fVar5 = fdb_set_kv(pfStack_a68,"a",1,"val-a",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111160;
  pfStack_a78 = (fdb_doc *)0x110ee9;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111165;
  in_RCX = "val-b";
  pfStack_a78 = (fdb_doc *)0x110f14;
  fVar5 = fdb_set_kv(pfStack_a68,"b",1,"val-b",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011116a;
  pfStack_a78 = (fdb_doc *)0x110f28;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011116f;
  in_RCX = "val-c";
  pfStack_a78 = (fdb_doc *)0x110f53;
  fVar5 = fdb_set_kv(pfStack_a68,"c",1,"val-c",5);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111174;
  pfStack_a78 = (fdb_doc *)0x110f67;
  fVar5 = fdb_commit((fdb_file_handle *)auStack_a60._8_8_,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111179;
  pfStack_a78 = (fdb_doc *)0x110f7e;
  fVar5 = fdb_get_kvs_info(pfStack_a68,(fdb_kvs_info *)(auStack_a48 + 0x10));
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011117e;
  in_RCX = (char *)0x1;
  pfStack_a78 = (fdb_doc *)0x110fba;
  fVar5 = fdb_iterator_init(pfStack_a68,(fdb_iterator **)auStack_a60,"a",1,"c",1,0);
  pfVar25 = pfStack_a30;
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111183;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x110fda;
  fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_a60._0_8_,"b",1,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111188;
  pfStack_a78 = (fdb_doc *)0x110fec;
  fVar5 = fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011118d;
  pfStack_a78 = (fdb_doc *)0x111006;
  fVar5 = fdb_snapshot_open(pfStack_a68,&pfStack_a50,(fdb_seqnum_t)pfStack_a30);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111192;
  in_RCX = (char *)0x1;
  pfStack_a78 = (fdb_doc *)0x11103d;
  fVar5 = fdb_iterator_init(pfStack_a50,(fdb_iterator **)auStack_a60,"a",1,"c",1,0);
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111197;
  in_RCX = (char *)0x0;
  pfStack_a78 = (fdb_doc *)0x11105d;
  fVar5 = fdb_iterator_seek((fdb_iterator *)auStack_a60._0_8_,"b",1,'\0');
  if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011119c;
  pfStack_a78 = (fdb_doc *)0x11106f;
  fVar5 = fdb_iterator_close((fdb_iterator *)auStack_a60._0_8_);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_a78 = (fdb_doc *)0x111081;
    fdb_kvs_close(pfStack_a68);
    pfStack_a78 = (fdb_doc *)0x11108b;
    fdb_kvs_close(pfStack_a50);
    pfStack_a78 = (fdb_doc *)0x111095;
    fdb_close((fdb_file_handle *)auStack_a60._8_8_);
    pfStack_a78 = (fdb_doc *)0x11109a;
    fdb_shutdown();
    pfStack_a78 = (fdb_doc *)0x11109f;
    memleak_end();
    pcVar21 = "%s PASSED\n";
    if (snapshot_test()::__test_pass != '\0') {
      pcVar21 = "%s FAILED\n";
    }
    pfStack_a78 = (fdb_doc *)0x1110d0;
    fprintf(_stderr,pcVar21,"snapshot test");
    return;
  }
  goto LAB_001111a1;
LAB_00111a32:
  pfStack_1388 = (fdb_kvs_handle *)0x111a37;
  snapshot_with_uncomitted_data_test();
  pfVar17 = (fdb_kvs_handle *)pcVar28;
LAB_00111a37:
  pfStack_1388 = (fdb_kvs_handle *)0x111a3c;
  snapshot_with_uncomitted_data_test();
  goto LAB_00111a3c;
LAB_00112f50:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f55;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f55:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f5a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f5a:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f6a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f6a:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f75;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f75:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f85;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f85:
  pfVar17 = (fdb_kvs_handle *)pcVar16;
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f8a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f8a:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112f9a;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112f9a:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fa5;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fa5:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fb0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fb0:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fc0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fc0:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fcb;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fcb:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fd0;
  in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fd0:
  pfStack_1ed0 = (fdb_kvs_handle *)0x112fd5;
  in_memory_snapshot_on_dirty_hbtrie_test();
  goto LAB_00112fd5;
LAB_0011350e:
  pfStack_22e8 = (fdb_kvs_handle *)0x11351e;
  in_memory_snapshot_compaction_test();
LAB_0011351e:
  pfStack_22e8 = (fdb_kvs_handle *)0x113529;
  in_memory_snapshot_compaction_test();
LAB_00113529:
  pfStack_22e8 = (fdb_kvs_handle *)0x113539;
  in_memory_snapshot_compaction_test();
LAB_00113539:
  pfStack_22e8 = (fdb_kvs_handle *)0x113544;
  in_memory_snapshot_compaction_test();
  goto LAB_00113544;
LAB_00113a98:
  pcStack_25a0 = (code *)0x113aa8;
  cb_inmem_snap();
LAB_00113aa8:
  pcStack_25a0 = (code *)0x113ab8;
  cb_inmem_snap();
LAB_00113ab8:
  pcStack_25a0 = (code *)0x113ac8;
  cb_inmem_snap();
LAB_00113ac8:
  pfVar17 = (fdb_kvs_handle *)afStack_2418;
  pcVar21 = auStack_251e + 6;
  pcStack_25a0 = (code *)0x113ad8;
  cb_inmem_snap();
  goto LAB_00113ad8;
LAB_0011456a:
  pfStack_2b18 = (fdb_iterator *)0x114575;
  snapshot_clone_test();
  pfVar15 = pfVar12;
LAB_00114575:
  pfVar12 = pfVar15;
  pfStack_2b18 = (fdb_iterator *)0x11457a;
  snapshot_clone_test();
LAB_0011457a:
  pfStack_2b18 = (fdb_iterator *)0x114585;
  snapshot_clone_test();
LAB_00114585:
  pfVar17 = (fdb_kvs_handle *)&pfStack_2b00;
  pfStack_2b18 = (fdb_iterator *)0x114590;
  snapshot_clone_test();
  goto LAB_00114590;
LAB_00111108:
  pfStack_a78 = (fdb_doc *)0x111113;
  snapshot_test();
  pfVar27 = fconfig_00;
LAB_00111113:
  fconfig_00 = pfVar27;
  pfStack_a78 = (fdb_doc *)0x111118;
  snapshot_test();
LAB_00111118:
  pfStack_a78 = (fdb_doc *)0x111123;
  snapshot_test();
LAB_00111123:
  pfVar25 = (fdb_doc *)auStack_a48;
  pfStack_a78 = (fdb_doc *)0x11112e;
  snapshot_test();
LAB_0011112e:
  pfStack_a78 = (fdb_doc *)0x111133;
  snapshot_test();
LAB_00111133:
  pfStack_a78 = (fdb_doc *)0x111138;
  snapshot_test();
LAB_00111138:
  pfStack_a78 = (fdb_doc *)0x11113d;
  snapshot_test();
LAB_0011113d:
  pfStack_a78 = (fdb_doc *)0x111142;
  snapshot_test();
LAB_00111142:
  pfStack_a78 = (fdb_doc *)0x111147;
  snapshot_test();
LAB_00111147:
  pfStack_a78 = (fdb_doc *)0x11114c;
  snapshot_test();
LAB_0011114c:
  pfStack_a78 = (fdb_doc *)0x111151;
  snapshot_test();
LAB_00111151:
  pfStack_a78 = (fdb_doc *)0x111156;
  snapshot_test();
LAB_00111156:
  pfStack_a78 = (fdb_doc *)0x11115b;
  snapshot_test();
LAB_0011115b:
  pfStack_a78 = (fdb_doc *)0x111160;
  snapshot_test();
LAB_00111160:
  pfStack_a78 = (fdb_doc *)0x111165;
  snapshot_test();
LAB_00111165:
  pfStack_a78 = (fdb_doc *)0x11116a;
  snapshot_test();
LAB_0011116a:
  pfStack_a78 = (fdb_doc *)0x11116f;
  snapshot_test();
LAB_0011116f:
  pfStack_a78 = (fdb_doc *)0x111174;
  snapshot_test();
LAB_00111174:
  pfStack_a78 = (fdb_doc *)0x111179;
  snapshot_test();
LAB_00111179:
  pfStack_a78 = (fdb_doc *)0x11117e;
  snapshot_test();
LAB_0011117e:
  pfStack_a78 = (fdb_doc *)0x111183;
  snapshot_test();
LAB_00111183:
  pfStack_a78 = (fdb_doc *)0x111188;
  snapshot_test();
LAB_00111188:
  pfStack_a78 = (fdb_doc *)0x11118d;
  snapshot_test();
LAB_0011118d:
  pfStack_a78 = (fdb_doc *)0x111192;
  snapshot_test();
LAB_00111192:
  pfStack_a78 = (fdb_doc *)0x111197;
  snapshot_test();
LAB_00111197:
  pfStack_a78 = (fdb_doc *)0x11119c;
  snapshot_test();
LAB_0011119c:
  pfStack_a78 = (fdb_doc *)0x1111a1;
  snapshot_test();
LAB_001111a1:
  pfStack_a78 = (fdb_doc *)snapshot_stats_test;
  snapshot_test();
  pfStack_fc0 = (fdb_kvs_handle *)0x1111c3;
  pfStack_aa0 = pfVar25;
  pfStack_a98 = (fdb_kvs_handle *)pcVar21;
  pfStack_a90 = (fdb_kvs_handle *)unaff_R13;
  pfStack_a88 = fconfig_00;
  pfStack_a80 = config;
  pfStack_a78 = __s_00;
  gettimeofday(&tStack_f60,(__timezone_ptr_t)0x0);
  pfStack_fc0 = (fdb_kvs_handle *)0x1111c8;
  memleak_start();
  pfStack_fc0 = (fdb_kvs_handle *)0x1111d7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = (fdb_config *)(auStack_d98 + 0x200);
  pfStack_fc0 = (fdb_kvs_handle *)0x1111e7;
  fdb_get_default_config();
  pcVar16 = auStack_f50;
  pfStack_fc0 = (fdb_kvs_handle *)0x1111f4;
  fdb_get_default_kvs_config();
  uStack_b90 = 0;
  uStack_b88 = 0x400;
  uStack_b74 = 1;
  uStack_b69 = 0;
  pfStack_fc0 = (fdb_kvs_handle *)0x111219;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_fc0 = (fdb_kvs_handle *)0x111230;
  fVar5 = fdb_open((fdb_file_handle **)&phStack_fa0,"./mvcc_test1",pfVar11);
  handle._M_i = (__int_type)(uint)fVar5;
  pfStack_fc0 = (fdb_kvs_handle *)0x111242;
  fdb_kvs_open_default((fdb_file_handle *)phStack_fa0,&pfStack_fa8,(fdb_kvs_config *)pcVar16);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pcVar21 = (char *)0x0;
    uVar24 = 0;
    do {
      pfStack_fc0 = (fdb_kvs_handle *)0x11126a;
      sprintf(auStack_d98 + 0x100,"key%d",uVar24 & 0xffffffff);
      pfStack_fc0 = (fdb_kvs_handle *)0x111282;
      sprintf(auStack_d98,"meta%d",uVar24 & 0xffffffff);
      pfStack_fc0 = (fdb_kvs_handle *)0x11129a;
      sprintf(acStack_e98,"body%d",uVar24 & 0xffffffff);
      pcVar16 = auStack_f50 + (long)pcVar21 + 0x18;
      pfStack_fc0 = (fdb_kvs_handle *)0x1112ad;
      unaff_R13 = (char *)strlen(auStack_d98 + 0x100);
      handle._M_i = (__int_type)auStack_d98;
      pfStack_fc0 = (fdb_kvs_handle *)0x1112c0;
      pfVar11 = (fdb_config *)strlen((char *)handle._M_i);
      pfStack_fc0 = (fdb_kvs_handle *)0x1112d0;
      sVar8 = strlen(acStack_e98);
      pfStack_fc0 = (fdb_kvs_handle *)0x1112f5;
      in_RCX = (char *)handle._M_i;
      fdb_doc_create((fdb_doc **)pcVar16,auStack_d98 + 0x100,(size_t)unaff_R13,(void *)handle._M_i,
                     (size_t)pfVar11,acStack_e98,sVar8);
      pfStack_fc0 = (fdb_kvs_handle *)0x111307;
      fdb_set(pfStack_fa8,*(fdb_doc **)(auStack_f50 + uVar24 * 8 + 0x18));
      pfStack_fc0 = (fdb_kvs_handle *)0x111314;
      fdb_doc_free(*(fdb_doc **)(auStack_f50 + uVar24 * 8 + 0x18));
      uVar24 = uVar24 + 1;
      pcVar21 = (char *)((long)pcVar21 + 8);
    } while (uVar24 != 0x14);
    pfStack_fc0 = (fdb_kvs_handle *)0x111334;
    fdb_commit((fdb_file_handle *)phStack_fa0,'\x01');
    pfStack_fc0 = (fdb_kvs_handle *)0x111343;
    fVar5 = fdb_get_kvs_info(pfStack_fa8,(fdb_kvs_info *)(auStack_f98 + 8));
    seqnum = pphStack_f88;
    pphVar4 = (hbtrie **)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114c8;
    pfStack_fc0 = (fdb_kvs_handle *)0x111368;
    fVar5 = fdb_set_log_callback(pfStack_fa8,logCallbackFunc,"snapshot_stats_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114cd;
    pfStack_fc0 = (fdb_kvs_handle *)0x111382;
    fVar5 = fdb_snapshot_open(pfStack_fa8,(fdb_kvs_handle **)auStack_f98,(fdb_seqnum_t)seqnum);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001114d2;
    pfVar11 = (fdb_config *)&pphStack_f88;
    pfStack_fc0 = (fdb_kvs_handle *)0x1113a1;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_f98._0_8_,(fdb_kvs_info *)(auStack_f98 + 8));
    if (pphStack_f88 != seqnum) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1113b2;
      snapshot_stats_test();
    }
    pcVar21 = (char *)apkStack_f80;
    if (apkStack_f80[0] != (kvs_info *)0x14) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1113c6;
      snapshot_stats_test();
    }
    pcVar16 = (char *)&phStack_f68;
    if (phStack_f68 != phStack_fa0) {
      pfStack_fc0 = (fdb_kvs_handle *)0x1113e2;
      snapshot_stats_test();
    }
    unaff_R13 = auStack_f98;
    pfStack_fc0 = (fdb_kvs_handle *)0x1113f0;
    fdb_kvs_close((fdb_kvs_handle *)auStack_f98._0_8_);
    pfStack_fc0 = (fdb_kvs_handle *)0x111404;
    fVar5 = fdb_snapshot_open(pfStack_fa8,(fdb_kvs_handle **)unaff_R13,0xffffffffffffffff);
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_fc0 = (fdb_kvs_handle *)0x11141e;
      fdb_get_kvs_info((fdb_kvs_handle *)auStack_f98._0_8_,(fdb_kvs_info *)(auStack_f98 + 8));
      if (pphStack_f88 != seqnum) {
        pfStack_fc0 = (fdb_kvs_handle *)0x11142f;
        snapshot_stats_test();
      }
      if (apkStack_f80[0] != (kvs_info *)0x14) {
        pfStack_fc0 = (fdb_kvs_handle *)0x11143f;
        snapshot_stats_test();
      }
      if (phStack_f68 != phStack_fa0) {
        pfStack_fc0 = (fdb_kvs_handle *)0x111458;
        snapshot_stats_test();
      }
      pfStack_fc0 = (fdb_kvs_handle *)0x111462;
      fdb_kvs_close((fdb_kvs_handle *)auStack_f98._0_8_);
      pfStack_fc0 = (fdb_kvs_handle *)0x11146c;
      fdb_kvs_close(pfStack_fa8);
      pfStack_fc0 = (fdb_kvs_handle *)0x111476;
      fdb_close((fdb_file_handle *)phStack_fa0);
      pfStack_fc0 = (fdb_kvs_handle *)0x11147b;
      fdb_shutdown();
      pfStack_fc0 = (fdb_kvs_handle *)0x111480;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_stats_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_fc0 = (fdb_kvs_handle *)0x1114b1;
      fprintf(_stderr,pcVar21,"snapshot stats test");
      return;
    }
  }
  else {
    pfStack_fc0 = (fdb_kvs_handle *)0x1114c8;
    snapshot_stats_test();
    pphVar4 = &phStack_fa0;
LAB_001114c8:
    seqnum = pphVar4;
    pfStack_fc0 = (fdb_kvs_handle *)0x1114cd;
    snapshot_stats_test();
LAB_001114cd:
    pfStack_fc0 = (fdb_kvs_handle *)0x1114d2;
    snapshot_stats_test();
LAB_001114d2:
    pfStack_fc0 = (fdb_kvs_handle *)0x1114d7;
    snapshot_stats_test();
  }
  pfStack_fc0 = (fdb_kvs_handle *)snapshot_with_uncomitted_data_test;
  snapshot_stats_test();
  pfStack_1388 = (fdb_kvs_handle *)0x1114fc;
  pphStack_fe8 = seqnum;
  pfStack_fe0 = (fdb_kvs_handle *)pcVar21;
  pfStack_fd8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_fd0 = pfVar11;
  pfStack_fc8 = (fdb_kvs_handle *)pcVar16;
  pfStack_fc0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1318 + 0x18),(__timezone_ptr_t)0x0);
  pfStack_10f0 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_10e8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1388 = (fdb_kvs_handle *)0x111524;
  system((char *)&pfStack_10f0);
  pfStack_1388 = (fdb_kvs_handle *)0x111529;
  memleak_start();
  pfStack_1388 = (fdb_kvs_handle *)0x111533;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfStack_1388 = (fdb_kvs_handle *)0x111540;
  srand(0x4d2);
  pfVar17 = (fdb_kvs_handle *)(auStack_12f0 + 0x108);
  pfStack_1388 = (fdb_kvs_handle *)0x111550;
  fdb_get_default_config();
  uStack_11c8 = 1;
  uStack_11d0 = '\x01';
  uStack_11a8 = 1;
  sStack_11e0 = 0;
  pfStack_1388 = (fdb_kvs_handle *)0x111570;
  fdb_get_default_kvs_config();
  pfStack_1388 = (fdb_kvs_handle *)0x111584;
  fVar5 = fdb_open(&pfStack_1360,"./mvcc_test9",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1115a2;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1370,(char *)0x0,(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a41;
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1115c5;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1368,"db1",(fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a46;
    in_RCX = auStack_1318;
    pfStack_1388 = (fdb_kvs_handle *)0x1115e8;
    fVar5 = fdb_kvs_open(pfStack_1360,&pfStack_1378,"db2",(fdb_kvs_config *)in_RCX);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a4b;
    puStack_1358 = (undefined4 *)((long)&pfVar12->kvs + 2);
    pcVar28 = "key%06d";
    pcVar16 = auStack_12f0;
    pcVar21 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1388 = (fdb_kvs_handle *)0x111623;
      sprintf(pcVar16,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1358 + 1) = 0x3e;
      *puStack_1358 = 0x646e653c;
      pfStack_1388 = (fdb_kvs_handle *)0x111651;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1370;
      pfStack_1388 = (fdb_kvs_handle *)0x11165e;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x111676;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar16,sVar8 + 1,pfVar12,0x20);
      pfVar14 = pfStack_1368;
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_1388 = (fdb_kvs_handle *)0x111a28;
        snapshot_with_uncomitted_data_test();
LAB_00111a28:
        unaff_R13 = (char *)pfVar17;
        pfStack_1388 = (fdb_kvs_handle *)0x111a2d;
        snapshot_with_uncomitted_data_test();
LAB_00111a2d:
        pfStack_1388 = (fdb_kvs_handle *)0x111a32;
        snapshot_with_uncomitted_data_test();
        goto LAB_00111a32;
      }
      pfStack_1388 = (fdb_kvs_handle *)0x11168b;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x1116a3;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar14,pcVar16,sVar8 + 1,pfVar12,0x20);
      unaff_R13 = (char *)pfStack_1378;
      pfVar17 = pfVar14;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a28;
      pfStack_1388 = (fdb_kvs_handle *)0x1116b8;
      sVar8 = strlen(pcVar16);
      pfStack_1388 = (fdb_kvs_handle *)0x1116d0;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar16,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a2d;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_1388 = (fdb_kvs_handle *)0x1116f2;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a50;
    pfStack_1388 = (fdb_kvs_handle *)0x11170c;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a55;
    pfStack_1388 = (fdb_kvs_handle *)0x111723;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a5a;
    pfStack_1388 = (fdb_kvs_handle *)0x11173d;
    fVar5 = fdb_snapshot_open(pfStack_1368,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a5f;
    pfStack_1388 = (fdb_kvs_handle *)0x111754;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a64;
    pfStack_1388 = (fdb_kvs_handle *)0x11176e;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a69;
    pfStack_1388 = (fdb_kvs_handle *)0x111782;
    fVar5 = fdb_commit(pfStack_1360,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a6e;
    pfStack_1388 = (fdb_kvs_handle *)0x111799;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    pfVar17 = (fdb_kvs_handle *)auStack_1350._8_8_;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a73;
    pfStack_1388 = (fdb_kvs_handle *)0x1117b4;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a78;
    pcVar16 = auStack_1350 + 8;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1350._8_8_) {
      pfStack_1388 = (fdb_kvs_handle *)0x1117d1;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1388 = (fdb_kvs_handle *)0x1117e0;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    pcVar28 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a7d;
    if (pfVar17 != (fdb_kvs_handle *)auStack_1350._8_8_) {
      pfStack_1388 = (fdb_kvs_handle *)0x1117fa;
      snapshot_with_uncomitted_data_test();
    }
    pfStack_1320 = pfVar17;
    pcVar16 = "key%06d";
    pcVar21 = auStack_12f0;
    unaff_R13 = "value%d";
    handle._M_i = 0;
    do {
      pfStack_1388 = (fdb_kvs_handle *)0x111826;
      sprintf(pcVar21,"key%06d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1358 + 1) = 0x3e;
      *puStack_1358 = 0x646e653c;
      pfStack_1388 = (fdb_kvs_handle *)0x111854;
      sprintf((char *)pfVar12,"value%d",handle._M_i);
      pfVar17 = pfStack_1370;
      pfStack_1388 = (fdb_kvs_handle *)0x111861;
      sVar8 = strlen(pcVar21);
      pfStack_1388 = (fdb_kvs_handle *)0x111879;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv(pfVar17,pcVar21,sVar8 + 1,pfVar12,0x20);
      pcVar28 = (char *)pfStack_1378;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a37;
      pfStack_1388 = (fdb_kvs_handle *)0x11188e;
      sVar8 = strlen(pcVar21);
      pfStack_1388 = (fdb_kvs_handle *)0x1118a6;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)pcVar28,pcVar21,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a32;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_1388 = (fdb_kvs_handle *)0x1118c8;
    fVar5 = fdb_get_kvs_info(pfStack_1368,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a82;
    pfStack_1388 = (fdb_kvs_handle *)0x1118e2;
    fVar5 = fdb_snapshot_open(pfStack_1368,&pfStack_1380,auStack_1350._8_8_);
    pcVar28 = (char *)pfStack_1320;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a87;
    pfStack_1388 = (fdb_kvs_handle *)0x1118f8;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a8c;
    pfStack_1388 = (fdb_kvs_handle *)0x11190f;
    fVar5 = fdb_get_kvs_info(pfStack_1378,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a91;
    pfStack_1388 = (fdb_kvs_handle *)0x111929;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111a96;
    pfStack_1388 = (fdb_kvs_handle *)0x111941;
    fVar5 = fdb_snapshot_open(pfStack_1378,&pfStack_1380,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111a9b;
    pfStack_1388 = (fdb_kvs_handle *)0x111952;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aa0;
    pfStack_1388 = (fdb_kvs_handle *)0x111969;
    fVar5 = fdb_get_kvs_info(pfStack_1370,(fdb_kvs_info *)auStack_1350);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aa5;
    pfStack_1388 = (fdb_kvs_handle *)0x111983;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,auStack_1350._8_8_);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00111aaa;
    pfStack_1388 = (fdb_kvs_handle *)0x11199b;
    fVar5 = fdb_snapshot_open(pfStack_1370,&pfStack_1380,(fdb_seqnum_t)pcVar28);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111aaf;
    pfStack_1388 = (fdb_kvs_handle *)0x1119ac;
    fVar5 = fdb_kvs_close(pfStack_1380);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ab4;
    pfStack_1388 = (fdb_kvs_handle *)0x1119be;
    fVar5 = fdb_close(pfStack_1360);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00111ab9;
    pfStack_1388 = (fdb_kvs_handle *)0x1119cb;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1388 = (fdb_kvs_handle *)0x1119db;
      free(pfVar12);
      pfStack_1388 = (fdb_kvs_handle *)0x1119e0;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (snapshot_with_uncomitted_data_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1388 = (fdb_kvs_handle *)0x111a11;
      fprintf(_stderr,pcVar21,"snapshot with uncomitted data in other KVS test");
      return;
    }
  }
  else {
LAB_00111a3c:
    pfStack_1388 = (fdb_kvs_handle *)0x111a41;
    snapshot_with_uncomitted_data_test();
LAB_00111a41:
    pfStack_1388 = (fdb_kvs_handle *)0x111a46;
    snapshot_with_uncomitted_data_test();
LAB_00111a46:
    pfStack_1388 = (fdb_kvs_handle *)0x111a4b;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111a4b:
    pfStack_1388 = (fdb_kvs_handle *)0x111a50;
    snapshot_with_uncomitted_data_test();
LAB_00111a50:
    pfStack_1388 = (fdb_kvs_handle *)0x111a55;
    snapshot_with_uncomitted_data_test();
LAB_00111a55:
    pfStack_1388 = (fdb_kvs_handle *)0x111a5a;
    snapshot_with_uncomitted_data_test();
LAB_00111a5a:
    pfStack_1388 = (fdb_kvs_handle *)0x111a5f;
    snapshot_with_uncomitted_data_test();
LAB_00111a5f:
    pfStack_1388 = (fdb_kvs_handle *)0x111a64;
    snapshot_with_uncomitted_data_test();
LAB_00111a64:
    pfStack_1388 = (fdb_kvs_handle *)0x111a69;
    snapshot_with_uncomitted_data_test();
LAB_00111a69:
    pfStack_1388 = (fdb_kvs_handle *)0x111a6e;
    snapshot_with_uncomitted_data_test();
LAB_00111a6e:
    pfStack_1388 = (fdb_kvs_handle *)0x111a73;
    snapshot_with_uncomitted_data_test();
LAB_00111a73:
    pfVar17 = (fdb_kvs_handle *)pcVar28;
    pfStack_1388 = (fdb_kvs_handle *)0x111a78;
    snapshot_with_uncomitted_data_test();
LAB_00111a78:
    pfStack_1388 = (fdb_kvs_handle *)0x111a7d;
    snapshot_with_uncomitted_data_test();
    pcVar28 = (char *)pfVar17;
LAB_00111a7d:
    pfStack_1388 = (fdb_kvs_handle *)0x111a82;
    snapshot_with_uncomitted_data_test();
LAB_00111a82:
    pfStack_1388 = (fdb_kvs_handle *)0x111a87;
    snapshot_with_uncomitted_data_test();
LAB_00111a87:
    pfStack_1388 = (fdb_kvs_handle *)0x111a8c;
    snapshot_with_uncomitted_data_test();
LAB_00111a8c:
    pfStack_1388 = (fdb_kvs_handle *)0x111a91;
    snapshot_with_uncomitted_data_test();
LAB_00111a91:
    pfStack_1388 = (fdb_kvs_handle *)0x111a96;
    snapshot_with_uncomitted_data_test();
LAB_00111a96:
    pfStack_1388 = (fdb_kvs_handle *)0x111a9b;
    snapshot_with_uncomitted_data_test();
LAB_00111a9b:
    pfStack_1388 = (fdb_kvs_handle *)0x111aa0;
    snapshot_with_uncomitted_data_test();
LAB_00111aa0:
    pfStack_1388 = (fdb_kvs_handle *)0x111aa5;
    snapshot_with_uncomitted_data_test();
LAB_00111aa5:
    pfStack_1388 = (fdb_kvs_handle *)0x111aaa;
    snapshot_with_uncomitted_data_test();
LAB_00111aaa:
    pfStack_1388 = (fdb_kvs_handle *)0x111aaf;
    snapshot_with_uncomitted_data_test();
LAB_00111aaf:
    pfStack_1388 = (fdb_kvs_handle *)0x111ab4;
    snapshot_with_uncomitted_data_test();
LAB_00111ab4:
    pfStack_1388 = (fdb_kvs_handle *)0x111ab9;
    snapshot_with_uncomitted_data_test();
LAB_00111ab9:
    pfStack_1388 = (fdb_kvs_handle *)0x111abe;
    snapshot_with_uncomitted_data_test();
  }
  pfStack_1388 = (fdb_kvs_handle *)in_memory_snapshot_test;
  snapshot_with_uncomitted_data_test();
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae3;
  pfStack_13b0 = pfVar12;
  pfStack_13a8 = (fdb_kvs_handle *)pcVar21;
  pfStack_13a0 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1398 = (fdb_kvs_handle *)pcVar28;
  pfStack_1390 = (fdb_kvs_handle *)pcVar16;
  pfStack_1388 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)(auStack_1858 + 0xa0),(__timezone_ptr_t)0x0);
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ae8;
  memleak_start();
  pcVar28 = "rm -rf  mvcc_test* > errorlog.txt";
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111af7;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar11 = &fStack_14a8;
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b07;
  fdb_get_default_config();
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b11;
  fdb_get_default_kvs_config();
  fStack_14a8.buffercache_size = 0;
  fStack_14a8.wal_threshold = 0x400;
  fStack_14a8.flags = 1;
  fStack_14a8.compaction_threshold = '\0';
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b36;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b4a;
  fVar5 = fdb_open(&pfStack_18c0,"./mvcc_test1",pfVar11);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b66;
    fVar5 = fdb_kvs_open_default(pfStack_18c0,&pfStack_18d0,&fStack_1870);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011224b;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b7f;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112250;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111b96;
    fdb_get_kvs_info(pfStack_18c8,&fStack_18a0);
    if ((fdb_config *)fStack_18a0.last_seqnum != (fdb_config *)0x0) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ba6;
      in_memory_snapshot_test();
    }
    pcVar28 = auStack_18b8;
    in_RCX = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bc9;
    fdb_iterator_init(pfStack_18c8,(fdb_iterator **)pcVar28,(void *)0x0,0,(void *)0x0,0,0);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bd6;
    fVar5 = fdb_iterator_get((fdb_iterator *)auStack_18b8._0_8_,(fdb_doc **)(auStack_18b8 + 8));
    _Var13._M_i = (__int_type)pfVar11;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_00112255;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111be9;
    fdb_iterator_close((fdb_iterator *)auStack_18b8._0_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111bf3;
    fdb_kvs_close(pfStack_18c8);
    lVar18 = 0;
    uVar24 = 0;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c15;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c31;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c4d;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c60;
      sVar8 = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c6b;
      sVar9 = strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c76;
      sVar10 = strlen(pcVar21);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111c9b;
      fdb_doc_create((fdb_doc **)(auStack_1858 + lVar18),acStack_17a8,sVar8,auStack_16a8,sVar9,
                     pcVar21,sVar10);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cad;
      fdb_set(pfStack_18d0,*(fdb_doc **)(auStack_1858 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ccd;
    fdb_commit(pfStack_18c0,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_1858 + 0x28);
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111cf7;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d13;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d2f;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d37;
      sVar8 = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d42;
      sVar9 = strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d4d;
      sVar10 = strlen(pcVar21);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d6d;
      fdb_doc_create(ppfVar26,acStack_17a8,sVar8,auStack_16a8,sVar9,pcVar21,sVar10);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111d7a;
      fdb_set(pfStack_18d0,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111da9;
    sprintf(acStack_17a8,"key%d",9);
    pcVar16 = auStack_16a8;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111dc7;
    sprintf(pcVar16,"meta%d",9);
    pcVar21 = auStack_16a8 + 0x100;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111de5;
    sprintf(pcVar21,"Body%d",9);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111df5;
    unaff_R13 = (char *)strlen(acStack_17a8);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e00;
    handle._M_i = strlen(pcVar16);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e0b;
    sVar8 = strlen(pcVar21);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e26;
    in_RCX = pcVar16;
    fdb_doc_create((fdb_doc **)(auStack_1858 + 0x48),acStack_17a8,(size_t)unaff_R13,pcVar16,
                   handle._M_i,pcVar21,sVar8);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e33;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e3f;
    fdb_commit(pfStack_18c0,'\0');
    **(undefined1 **)(auStack_1858._72_8_ + 0x40) = 0x62;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e56;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    _Var13._M_i = *(fdb_seqnum_t *)(auStack_1858._72_8_ + 0x28);
    pcVar28 = (char *)&fStack_18a0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e6f;
    fdb_get_kvs_info(pfStack_18d0,(fdb_kvs_info *)pcVar28);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111e82;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,fStack_18a0.last_seqnum);
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_0011225a;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ea6;
    pfStack_18a8 = (fdb_config *)_Var13._M_i;
    fVar5 = fdb_snapshot_open(pfStack_18d0,&pfStack_18c8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011225f;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eba;
    fdb_commit(pfStack_18c0,'\0');
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ecc;
    fdb_set(pfStack_18d0,(fdb_doc *)auStack_1858._72_8_);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111ed8;
    fdb_commit(pfStack_18c0,'\0');
    uVar24 = 10;
    pcVar28 = (char *)0x50;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111eff;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f1b;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      pcVar21 = auStack_16a8 + 0x100;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f37;
      sprintf(pcVar21,"body%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_1858 + (long)pcVar28);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f4a;
      _Var13._M_i = strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f55;
      unaff_R13 = (char *)strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f60;
      sVar8 = strlen(pcVar21);
      in_RCX = auStack_16a8;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f85;
      fdb_doc_create((fdb_doc **)handle._M_i,acStack_17a8,_Var13._M_i,in_RCX,(size_t)unaff_R13,
                     pcVar21,sVar8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111f97;
      fdb_set(pfStack_18d0,*(fdb_doc **)(auStack_1858 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pcVar28 = (char *)((long)pcVar28 + 8);
    } while (uVar24 != 0xf);
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fc0;
    fVar5 = fdb_set_log_callback(pfStack_18d0,logCallbackFunc,"in_memory_snapshot_test");
    pcVar16 = (char *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112264;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fda;
    fdb_get_kvs_info(pfStack_18c8,&fStack_18a0);
    if ((fdb_config *)fStack_18a0.last_seqnum != pfStack_18a8) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x111fef;
      in_memory_snapshot_test();
    }
    uVar24 = 0xf;
    pfVar11 = (fdb_config *)(auStack_1858 + 0x78);
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112017;
      sprintf(acStack_17a8,"key%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112032;
      sprintf(auStack_16a8,"meta%d",uVar24 & 0xffffffff);
      handle._M_i = (__int_type)(auStack_16a8 + 0x100);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11204d;
      sprintf((char *)handle._M_i,"body%d",uVar24 & 0xffffffff);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112055;
      pcVar16 = (char *)strlen(acStack_17a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112060;
      pcVar21 = (char *)strlen(auStack_16a8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11206b;
      sVar8 = strlen((char *)handle._M_i);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11208b;
      fdb_doc_create((fdb_doc **)pfVar11,acStack_17a8,(size_t)pcVar16,auStack_16a8,(size_t)pcVar21,
                     (void *)handle._M_i,sVar8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112098;
      fdb_set(pfStack_18d0,*(fdb_doc **)pfVar11);
      uVar24 = uVar24 + 1;
      pfVar11 = (fdb_config *)((long)pfVar11 + 8);
    } while (uVar24 != 0x14);
    unaff_R13 = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120b8;
    fdb_commit(pfStack_18c0,'\0');
    in_RCX = (char *)0x0;
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120d8;
    fdb_iterator_init(pfStack_18c8,(fdb_iterator **)auStack_18b8,(void *)0x0,0,(void *)0x0,0,0);
    pcVar28 = auStack_18b8 + 8;
    auStack_18b8._8_8_ = (fdb_config *)0x0;
    do {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1120f1;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_18b8._0_8_,(fdb_doc **)pcVar28);
      _Var13._M_i = auStack_18b8._8_8_;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0011222b:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112230
        ;
        in_memory_snapshot_test();
LAB_00112230:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11223b
        ;
        in_memory_snapshot_test();
LAB_0011223b:
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112246
        ;
        in_memory_snapshot_test();
        goto LAB_00112246;
      }
      pcVar16 = *(char **)(auStack_18b8._8_8_ + 0x20);
      handle._M_i = *(__int_type *)(auStack_1858 + (long)unaff_R13 * 8);
      pcVar21 = (char *)((fdb_kvs_handle *)handle._M_i)->op_stats;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11211c;
      iVar6 = bcmp(pcVar16,pcVar21,*(size_t *)auStack_18b8._8_8_);
      pfVar11 = (fdb_config *)_Var13._M_i;
      if (iVar6 != 0) {
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11222b
        ;
        in_memory_snapshot_test();
        goto LAB_0011222b;
      }
      pcVar16 = *(char **)(_Var13._M_i + 0x38);
      pcVar21 = (char *)((fdb_kvs_handle *)handle._M_i)->staletree;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11213b;
      iVar6 = bcmp(pcVar16,pcVar21,*(uint64_t *)(_Var13._M_i + 8));
      if (iVar6 != 0) goto LAB_0011223b;
      pcVar16 = *(char **)(_Var13._M_i + 0x40);
      pcVar21 = (char *)(((fdb_kvs_handle *)handle._M_i)->field_6).seqtree;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11215a;
      iVar6 = bcmp(pcVar16,pcVar21,*(uint64_t *)(_Var13._M_i + 0x10));
      if (iVar6 != 0) goto LAB_00112230;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11216a;
      fdb_doc_free((fdb_doc *)_Var13._M_i);
      auStack_18b8._8_8_ = (fdb_config *)0x0;
      unaff_R13 = &(((fdb_kvs_handle *)unaff_R13)->kvs_config).field_0x1;
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112180;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_18b8._0_8_);
    } while (fVar5 != FDB_RESULT_ITERATOR_FAIL);
    if ((int)unaff_R13 == 10) {
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11219d;
      fdb_iterator_close((fdb_iterator *)auStack_18b8._0_8_);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121a7;
      fdb_kvs_close(pfStack_18d0);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121b1;
      fdb_kvs_close(pfStack_18c8);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121bb;
      fdb_close(pfStack_18c0);
      lVar18 = 0;
      do {
        aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121ca
        ;
        fdb_doc_free(*(fdb_doc **)(auStack_1858 + lVar18 * 8));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x14);
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121d8;
      fdb_shutdown();
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1121dd;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11220e;
      fprintf(_stderr,pcVar21,"in-memory snapshot test");
      return;
    }
  }
  else {
LAB_00112246:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11224b;
    in_memory_snapshot_test();
LAB_0011224b:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112250;
    in_memory_snapshot_test();
LAB_00112250:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112255;
    in_memory_snapshot_test();
    _Var13._M_i = (__int_type)pfVar11;
LAB_00112255:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225a;
    in_memory_snapshot_test();
LAB_0011225a:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x11225f;
    in_memory_snapshot_test();
LAB_0011225f:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112264;
    in_memory_snapshot_test();
LAB_00112264:
    aStack_18e0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x112269;
    in_memory_snapshot_test();
  }
  aStack_18e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)in_memory_snapshot_cleanup_test;
  in_memory_snapshot_test();
  handle_00 = (char *)0x0;
  pfStack_1b08 = (fdb_kvs_handle *)0x112291;
  pfStack_1908 = (fdb_kvs_info *)pcVar28;
  aStack_1900.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)pcVar21;
  pfStack_18f8 = (fdb_kvs_handle *)unaff_R13;
  aStack_18f0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var13._M_i;
  pfStack_18e8 = (fdb_kvs_handle *)pcVar16;
  aStack_18e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)handle._M_i;
  gettimeofday(&tStack_1a30,(__timezone_ptr_t)0x0);
  pfStack_1b08 = (fdb_kvs_handle *)0x112296;
  memleak_start();
  aStack_1ae8.seqtree = (btree *)0x0;
  pcVar16 = "rm -rf  mvcc_test* > errorlog.txt";
  pfStack_1b08 = (fdb_kvs_handle *)0x1122aa;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)&fStack_1a20.seqtree_opt;
  pfStack_1b08 = (fdb_kvs_handle *)0x1122ba;
  fdb_get_default_config();
  pfStack_1b08 = (fdb_kvs_handle *)0x1122c4;
  fdb_get_default_kvs_config();
  fStack_1a20.compaction_minimum_filesize = 0x400;
  fStack_1a20._68_4_ = 1;
  fStack_1a20.prefetch_duration._7_1_ = '\0';
  fStack_1a20.breakpad_minidump_dir = (char *)0x0;
  pfStack_1b08 = (fdb_kvs_handle *)0x1122e8;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfStack_1b08 = (fdb_kvs_handle *)0x1122fc;
  fVar5 = fdb_open(&pfStack_1af0,"./mvcc_test1",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_1b08 = (fdb_kvs_handle *)0x112318;
    fVar5 = fdb_kvs_open_default(pfStack_1af0,&pfStack_1af8,&fStack_1aa8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ac;
    pfStack_1b08 = (fdb_kvs_handle *)0x112338;
    fVar5 = fdb_set_log_callback(pfStack_1af8,logCallbackFunc,"in_memory_snapshot_cleanup_test");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126b1;
    pcVar16 = (char *)aaStack_1a50;
    aaStack_1a50[0]._0_4_ = 0x79656b;
    pfVar17 = (fdb_kvs_handle *)&fStack_1a70;
    fStack_1a70._4_1_ = 0;
    fStack_1a70.create_if_missing = true;
    fStack_1a70._1_3_ = 0x617465;
    handle_00 = &fStack_1a90.create_if_missing;
    fStack_1a90._4_1_ = 0;
    fStack_1a90.create_if_missing = true;
    fStack_1a90._1_3_ = 0x79646f;
    pfStack_1b08 = (fdb_kvs_handle *)0x11237b;
    pcVar21 = (char *)strlen(pcVar16);
    pfStack_1b08 = (fdb_kvs_handle *)0x112386;
    unaff_R13 = (char *)strlen((char *)pfVar17);
    pfStack_1b08 = (fdb_kvs_handle *)0x112391;
    sVar8 = strlen(handle_00);
    handle._M_i = (__int_type)&aStack_1ae8;
    pfStack_1b08 = (fdb_kvs_handle *)0x1123b1;
    in_RCX = (char *)pfVar17;
    fdb_doc_create((fdb_doc **)handle._M_i,pcVar16,(size_t)pcVar21,pfVar17,(size_t)unaff_R13,
                   handle_00,sVar8);
    pfStack_1b08 = (fdb_kvs_handle *)0x1123bf;
    fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    pfStack_1b08 = (fdb_kvs_handle *)0x1123cb;
    fdb_commit(pfStack_1af0,'\0');
    pfStack_1b08 = (fdb_kvs_handle *)0x1123e1;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ac8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126b6;
    pfStack_1b08 = (fdb_kvs_handle *)0x1123f8;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126bb;
    pfStack_1b08 = (fdb_kvs_handle *)0x11240c;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126c0;
    pfStack_1b08 = (fdb_kvs_handle *)0x11242a;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ad0,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126c5;
    pfStack_1b08 = (fdb_kvs_handle *)0x112441;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ca;
    pfStack_1b08 = (fdb_kvs_handle *)0x112455;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126cf;
    pfStack_1b08 = (fdb_kvs_handle *)0x11246c;
    fVar5 = fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126d4;
    pfStack_1b08 = (fdb_kvs_handle *)0x112480;
    fVar5 = fdb_commit(pfStack_1af0,'\0');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126d9;
    pcVar16 = (char *)&aStack_1ae8;
    pfStack_1b08 = (fdb_kvs_handle *)0x112495;
    fdb_doc_free((fdb_doc *)aStack_1ae8.seqtree);
    pfVar17 = (fdb_kvs_handle *)&fStack_1a20;
    fStack_1a20.chunksize = 0x654b;
    fStack_1a20._2_2_ = 0x79;
    pfStack_1b08 = (fdb_kvs_handle *)0x1124ac;
    handle_00 = (char *)strlen((char *)pfVar17);
    pcVar21 = &fStack_1a70.create_if_missing;
    pfStack_1b08 = (fdb_kvs_handle *)0x1124bf;
    unaff_R13 = (char *)strlen(pcVar21);
    handle._M_i = (__int_type)&fStack_1a90;
    pfStack_1b08 = (fdb_kvs_handle *)0x1124cf;
    sVar8 = strlen((char *)handle._M_i);
    pfStack_1b08 = (fdb_kvs_handle *)0x1124ea;
    in_RCX = pcVar21;
    fdb_doc_create((fdb_doc **)pcVar16,pfVar17,(size_t)handle_00,pcVar21,(size_t)unaff_R13,
                   (void *)handle._M_i,sVar8);
    pfStack_1b08 = (fdb_kvs_handle *)0x1124f7;
    fdb_set(pfStack_1af8,(fdb_doc *)aStack_1ae8.seqtree);
    pfStack_1b08 = (fdb_kvs_handle *)0x11250d;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ad8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126de;
    pcVar16 = (char *)aaStack_1a50;
    pfStack_1b08 = (fdb_kvs_handle *)0x112525;
    sVar8 = strlen(pcVar16);
    pfVar17 = (fdb_kvs_handle *)&pfStack_1ae0;
    in_RCX = (char *)0x0;
    pfStack_1b08 = (fdb_kvs_handle *)0x112548;
    fdb_doc_create((fdb_doc **)pfVar17,pcVar16,sVar8,(void *)0x0,0,(void *)0x0,0);
    pfStack_1b08 = (fdb_kvs_handle *)0x112555;
    fVar5 = fdb_get(pfStack_1ac8,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126e3;
    pfStack_1b08 = (fdb_kvs_handle *)0x11256c;
    fVar5 = fdb_get(pfStack_1ad0,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126e8;
    pfStack_1b08 = (fdb_kvs_handle *)0x112583;
    fVar5 = fdb_get(pfStack_1ad8,pfStack_1ae0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126ed;
    pfStack_1b08 = (fdb_kvs_handle *)0x112595;
    fdb_doc_free(pfStack_1ae0);
    pfStack_1b08 = (fdb_kvs_handle *)0x1125a9;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ab0,1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126f2;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125c5;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ab8,2);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126f7;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125e1;
    fVar5 = fdb_snapshot_open(pfStack_1af8,&pfStack_1ac0,3);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001126fc;
    pfStack_1b08 = (fdb_kvs_handle *)0x1125f3;
    fdb_kvs_close(pfStack_1ac8);
    pfStack_1b08 = (fdb_kvs_handle *)0x1125fd;
    fdb_kvs_close(pfStack_1ad0);
    pfStack_1b08 = (fdb_kvs_handle *)0x112607;
    fdb_kvs_close(pfStack_1ad8);
    pfStack_1b08 = (fdb_kvs_handle *)0x112616;
    fVar5 = fdb_commit(pfStack_1af0,'\x01');
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1b08 = (fdb_kvs_handle *)0x112628;
      fdb_kvs_close(pfStack_1ab0);
      pfStack_1b08 = (fdb_kvs_handle *)0x112632;
      fdb_kvs_close(pfStack_1ab8);
      pfStack_1b08 = (fdb_kvs_handle *)0x11263c;
      fdb_kvs_close(pfStack_1ac0);
      pfStack_1b08 = (fdb_kvs_handle *)0x112646;
      fdb_kvs_close(pfStack_1af8);
      pfStack_1b08 = (fdb_kvs_handle *)0x112650;
      fdb_close(pfStack_1af0);
      pfStack_1b08 = (fdb_kvs_handle *)0x11265a;
      fdb_doc_free((fdb_doc *)aStack_1ae8.seqtree);
      pfStack_1b08 = (fdb_kvs_handle *)0x11265f;
      fdb_shutdown();
      pfStack_1b08 = (fdb_kvs_handle *)0x112664;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_cleanup_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1b08 = (fdb_kvs_handle *)0x112695;
      fprintf(_stderr,pcVar21,"in-memory snapshot cleanup test");
      return;
    }
  }
  else {
    pfStack_1b08 = (fdb_kvs_handle *)0x1126ac;
    in_memory_snapshot_cleanup_test();
LAB_001126ac:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126b1;
    in_memory_snapshot_cleanup_test();
LAB_001126b1:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126b6;
    in_memory_snapshot_cleanup_test();
LAB_001126b6:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126bb;
    in_memory_snapshot_cleanup_test();
LAB_001126bb:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126c0;
    in_memory_snapshot_cleanup_test();
LAB_001126c0:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126c5;
    in_memory_snapshot_cleanup_test();
LAB_001126c5:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126ca;
    in_memory_snapshot_cleanup_test();
LAB_001126ca:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126cf;
    in_memory_snapshot_cleanup_test();
LAB_001126cf:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126d4;
    in_memory_snapshot_cleanup_test();
LAB_001126d4:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126d9;
    in_memory_snapshot_cleanup_test();
LAB_001126d9:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126de;
    in_memory_snapshot_cleanup_test();
LAB_001126de:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126e3;
    in_memory_snapshot_cleanup_test();
LAB_001126e3:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126e8;
    in_memory_snapshot_cleanup_test();
LAB_001126e8:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126ed;
    in_memory_snapshot_cleanup_test();
LAB_001126ed:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126f2;
    in_memory_snapshot_cleanup_test();
LAB_001126f2:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126f7;
    in_memory_snapshot_cleanup_test();
LAB_001126f7:
    pfStack_1b08 = (fdb_kvs_handle *)0x1126fc;
    in_memory_snapshot_cleanup_test();
LAB_001126fc:
    pfStack_1b08 = (fdb_kvs_handle *)0x112701;
    in_memory_snapshot_cleanup_test();
  }
  pfStack_1b08 = (fdb_kvs_handle *)in_memory_snapshot_on_dirty_hbtrie_test;
  in_memory_snapshot_cleanup_test();
  pfStack_1ed0 = (fdb_kvs_handle *)0x112726;
  paStack_1b30 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)pcVar16;
  pfStack_1b28 = (fdb_kvs_handle *)pcVar21;
  pfStack_1b20 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1b18 = pfVar17;
  pfStack_1b10 = (fdb_kvs_handle *)handle_00;
  pfStack_1b08 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_1e48,(__timezone_ptr_t)0x0);
  pfStack_1c38 = (fdb_kvs_handle *)0x202066722d206d72;
  builtin_strncpy(acStack_1c30,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_1ed0 = (fdb_kvs_handle *)0x11274e;
  system((char *)&pfStack_1c38);
  pfStack_1ed0 = (fdb_kvs_handle *)0x112753;
  memleak_start();
  pfStack_1ed0 = (fdb_kvs_handle *)0x11275d;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)(auStack_1e38 + 0x108);
  pfStack_1ed0 = (fdb_kvs_handle *)0x112770;
  fdb_get_default_config();
  uStack_1d10._0_1_ = true;
  uStack_1d10._1_1_ = true;
  uStack_1d18 = '\x01';
  pcStack_1d20 = (char *)0x3c;
  uStack_1cf0 = 1;
  sStack_1d28 = 0;
  pfStack_1ed0 = (fdb_kvs_handle *)0x11279b;
  fdb_get_default_kvs_config();
  pfStack_1ed0 = (fdb_kvs_handle *)0x1127af;
  fVar5 = fdb_open(&pfStack_1e80,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_1e68 + 8;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1127d2;
    fVar5 = fdb_kvs_open(pfStack_1e80,&pfStack_1e98,"db",(fdb_kvs_config *)in_RCX);
    pcVar16 = (char *)pfVar17;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fda;
    puStack_1ea0 = (undefined4 *)((long)&pfVar12->kvs + 2);
    pcVar16 = "k%05d";
    handle_00 = auStack_1e38;
    pcVar21 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1ed0 = (fdb_kvs_handle *)0x11280d;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x11283b;
      sprintf((char *)pfVar12,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1e98;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112848;
      sVar8 = strlen(handle_00);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112860;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f50;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 0x1e);
    pfStack_1ed0 = (fdb_kvs_handle *)0x11287e;
    fVar5 = fdb_commit(pfStack_1e80,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fdf;
    pfStack_1ed0 = (fdb_kvs_handle *)0x11289c;
    fVar5 = fdb_snapshot_open(pfStack_1e98,&pfStack_1ea8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fe4;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1128ba;
    fVar5 = fdb_snapshot_open(pfStack_1ea8,&pfStack_1e90,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112fe9;
    handle._M_i = 0x1e;
    pcVar16 = "k%05d";
    handle_00 = auStack_1e38;
    pcVar21 = "value%08d";
    do {
      pfStack_1ed0 = (fdb_kvs_handle *)0x1128ec;
      sprintf(handle_00,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x11291a;
      sprintf((char *)pfVar12,"value%08d",handle._M_i);
      unaff_R13 = (char *)pfStack_1e98;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112927;
      sVar8 = strlen(handle_00);
      pfStack_1ed0 = (fdb_kvs_handle *)0x11293f;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,handle_00,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f55;
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 300);
    pfStack_1ed0 = (fdb_kvs_handle *)0x11296f;
    sprintf((char *)auStack_1e38,"k%05d",0x1e);
    handle_00 = (char *)pfStack_1ea8;
    pfStack_1ed0 = (fdb_kvs_handle *)0x11297c;
    sVar8 = strlen((char *)auStack_1e38);
    in_RCX = auStack_1e68;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112995;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)handle_00,(fdb_kvs_handle *)auStack_1e38,sVar8 + 1,
                       (void **)in_RCX,&sStack_1e70);
    pcVar16 = (char *)pfStack_1e90;
    pfVar17 = (fdb_kvs_handle *)auStack_1e38;
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00112fee;
    handle_00 = auStack_1e38;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129b2;
    sVar8 = strlen(handle_00);
    in_RCX = auStack_1e68;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129cb;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)pcVar16,handle_00,sVar8 + 1,(void **)in_RCX,&sStack_1e70);
    if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00112ff3;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129dd;
    fVar5 = fdb_kvs_close(pfStack_1ea8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ff8;
    pfStack_1ed0 = (fdb_kvs_handle *)0x1129ef;
    fVar5 = fdb_kvs_close(pfStack_1e90);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112ffd;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112a0d;
    fVar5 = fdb_snapshot_open(pfStack_1e98,&pfStack_1ea8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113002;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112a35;
    fVar5 = fdb_iterator_init(pfStack_1ea8,&pfStack_1eb0,(void *)0x0,0,(void *)0x0,0,0);
    pfVar17 = (fdb_kvs_handle *)pcVar16;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113007;
    pcVar21 = auStack_1e38;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112a66;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      pfVar17 = (fdb_kvs_handle *)pcVar16;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112a81;
      sprintf(pcVar21,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112aaf;
      sprintf((char *)pfVar12,"value%08d",handle._M_i);
      pcVar16 = (char *)pfStack_1ec0;
      handle_00 = (char *)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ac6;
      iVar6 = bcmp(handle_00,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00112f5a;
      handle_00 = (char *)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ae1;
      iVar6 = bcmp(handle_00,pfVar12,
                   (size_t)(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112f6a;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112af3;
      fdb_doc_free((fdb_doc *)pcVar16);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112afd;
      fVar5 = fdb_iterator_next(pfStack_1eb0);
      pfVar17 = (fdb_kvs_handle *)pcVar16;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_0011300c;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b1b;
    fVar5 = fdb_iterator_close(pfStack_1eb0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113011;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b39;
    fVar5 = fdb_snapshot_open(pfStack_1ea8,&pfStack_1e90,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113016;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b61;
    fVar5 = fdb_iterator_init(pfStack_1ea8,&pfStack_1eb0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011301b;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112b89;
    fVar5 = fdb_iterator_init(pfStack_1e90,&pfStack_1e78,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113020;
    in_RCX = (char *)0x0;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112bb1;
    fVar5 = fdb_iterator_init(pfStack_1e98,&pfStack_1e88,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113025;
    pcVar21 = auStack_1e38;
    unaff_R13 = "value%08d";
    handle_00 = "k%06d";
    uStack_1eb4 = 0;
    do {
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112bef;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      uVar19 = uStack_1eb4;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c0e;
      sprintf(pcVar21,"k%05d",(ulong)uStack_1eb4);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c3c;
      sprintf((char *)pfVar12,"value%08d",(ulong)uVar19);
      pcVar16 = (char *)pfStack_1ec0;
      handle._M_i = (__int_type)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c53;
      iVar6 = bcmp((void *)handle._M_i,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00112f75;
      handle._M_i = (__int_type)(((fdb_kvs_handle *)pcVar16)->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c6e;
      iVar6 = bcmp((void *)handle._M_i,pfVar12,
                   (size_t)(((fdb_kvs_handle *)pcVar16)->kvs_config).custom_cmp_param);
      pfVar17 = (fdb_kvs_handle *)pcVar16;
      if (iVar6 != 0) goto LAB_00112fa5;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c7e;
      fdb_doc_free((fdb_doc *)pcVar16);
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112c96;
      fVar5 = fdb_iterator_get(pfStack_1eb0,(fdb_doc **)&pfStack_1ec0);
      pfVar17 = pfStack_1ec0;
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00112f85;
      handle._M_i = (__int_type)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112cb5;
      iVar6 = bcmp((void *)handle._M_i,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00112f8a;
      handle._M_i = (__int_type)(pfVar17->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112cd0;
      iVar6 = bcmp((void *)handle._M_i,pfVar12,(size_t)(pfVar17->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112f9a;
      uVar19 = uStack_1eb4 + 1;
      handle._M_i = (__int_type)uVar19;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112ce6;
      fdb_doc_free((fdb_doc *)pfVar17);
      uStack_1eb4 = uVar19;
      if (uVar19 == 0x3c) {
        pcVar16 = (char *)0x0;
        do {
          pfStack_1ed0 = (fdb_kvs_handle *)0x112d02;
          sprintf(pcVar21,"k%06d",pcVar16);
          *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
          *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
          *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
          *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
          *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
          *(undefined4 *)&pfVar12->kvs = 0x78787878;
          *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
          *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
          *puStack_1ea0 = 0x646e653c;
          pfStack_1ed0 = (fdb_kvs_handle *)0x112d31;
          sprintf((char *)pfVar12,"value%08d",pcVar16);
          handle._M_i = (__int_type)pfStack_1e98;
          pfStack_1ed0 = (fdb_kvs_handle *)0x112d3e;
          sVar8 = strlen(pcVar21);
          pfStack_1ed0 = (fdb_kvs_handle *)0x112d56;
          in_RCX = (char *)pfVar12;
          fVar5 = fdb_set_kv((fdb_kvs_handle *)handle._M_i,pcVar21,sVar8 + 1,pfVar12,0x20);
          if (fVar5 != FDB_RESULT_SUCCESS) {
            pfStack_1ed0 = (fdb_kvs_handle *)0x112f50;
            in_memory_snapshot_on_dirty_hbtrie_test();
            goto LAB_00112f50;
          }
          uVar19 = (int)pcVar16 + 1;
          pcVar16 = (char *)(ulong)uVar19;
        } while (uVar19 != 3000);
      }
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d74;
      fVar5 = fdb_iterator_next(pfStack_1eb0);
      pfVar17 = (fdb_kvs_handle *)(ulong)(uint)fVar5;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112d81;
      fVar7 = fdb_iterator_next(pfStack_1e78);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00112fd0;
      }
      else if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_00112fcb;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if (uStack_1eb4 != 300) goto LAB_0011302a;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112db8;
    fVar5 = fdb_iterator_close(pfStack_1eb0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011302f;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112dca;
    fVar5 = fdb_iterator_close(pfStack_1e78);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113034;
    pcVar21 = auStack_1e38;
    unaff_R13 = "value%08d";
    handle._M_i = 0;
    do {
      pfStack_1ec0 = (fdb_kvs_handle *)0x0;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112dfb;
      fVar5 = fdb_iterator_get(pfStack_1e88,(fdb_doc **)&pfStack_1ec0);
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e16;
      sprintf(pcVar21,"k%05d",handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)(puStack_1ea0 + 1) = 0x3e;
      *puStack_1ea0 = 0x646e653c;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e44;
      sprintf((char *)pfVar12,"value%08d",handle._M_i);
      pfVar17 = pfStack_1ec0;
      handle_00 = (char *)pfStack_1ec0->op_stats;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e5b;
      iVar6 = bcmp(handle_00,pcVar21,*(size_t *)&pfStack_1ec0->kvs_config);
      if (iVar6 != 0) goto LAB_00112fb0;
      handle_00 = (char *)(pfVar17->field_6).seqtree;
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e76;
      iVar6 = bcmp(handle_00,pfVar12,(size_t)(pfVar17->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00112fc0;
      handle._M_i = (__int_type)((int)handle._M_i + 1);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e88;
      fdb_doc_free((fdb_doc *)pfVar17);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112e92;
      fVar5 = fdb_iterator_next(pfStack_1e88);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 300) goto LAB_00113039;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112eb0;
    fVar5 = fdb_iterator_close(pfStack_1e88);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011303e;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ec2;
    fVar5 = fdb_kvs_close(pfStack_1ea8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113043;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ed4;
    fVar5 = fdb_kvs_close(pfStack_1e90);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113048;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ee6;
    fVar5 = fdb_close(pfStack_1e80);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011304d;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ef3;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_1ed0 = (fdb_kvs_handle *)0x112f03;
      free(pfVar12);
      pfStack_1ed0 = (fdb_kvs_handle *)0x112f08;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_on_dirty_hbtrie_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_1ed0 = (fdb_kvs_handle *)0x112f39;
      fprintf(_stderr,pcVar21,"in-memory snapshot on dirty HB+trie nodes test");
      return;
    }
  }
  else {
LAB_00112fd5:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112fda;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pcVar16 = (char *)pfVar17;
LAB_00112fda:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112fdf;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fdf:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112fe4;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe4:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112fe9;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112fe9:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112fee;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar17 = (fdb_kvs_handle *)pcVar16;
LAB_00112fee:
    pcVar16 = (char *)pfVar17;
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ff3;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff3:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ff8;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ff8:
    pfStack_1ed0 = (fdb_kvs_handle *)0x112ffd;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00112ffd:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113002;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113002:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113007;
    in_memory_snapshot_on_dirty_hbtrie_test();
    pfVar17 = (fdb_kvs_handle *)pcVar16;
LAB_00113007:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11300c;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011300c:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113011;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113011:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113016;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113016:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11301b;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011301b:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113020;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113020:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113025;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113025:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11302a;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302a:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11302f;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011302f:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113034;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113034:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113039;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113039:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11303e;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011303e:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113043;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113043:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113048;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_00113048:
    pfStack_1ed0 = (fdb_kvs_handle *)0x11304d;
    in_memory_snapshot_on_dirty_hbtrie_test();
LAB_0011304d:
    pfStack_1ed0 = (fdb_kvs_handle *)0x113052;
    in_memory_snapshot_on_dirty_hbtrie_test();
  }
  pfStack_1ed0 = (fdb_kvs_handle *)in_memory_snapshot_compaction_test;
  in_memory_snapshot_on_dirty_hbtrie_test();
  pfStack_22e8 = (fdb_kvs_handle *)0x113077;
  pfStack_1ef8 = pfVar12;
  pfStack_1ef0 = (fdb_kvs_handle *)pcVar21;
  pfStack_1ee8 = (fdb_kvs_handle *)unaff_R13;
  pfStack_1ee0 = pfVar17;
  pfStack_1ed8 = (fdb_kvs_handle *)handle_00;
  pfStack_1ed0 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday(&tStack_2210,(__timezone_ptr_t)0x0);
  auStack_22d8._4_2_ = 100;
  auStack_22d8._0_4_ = 0x3530256b;
  auStack_22b0._8_2_ = 100;
  auStack_22b0._0_8_ = (fdb_log_callback)0x38302565756c6176;
  builtin_strncpy(acStack_1ff8,"mvcc_test* > errorlog.txt",0x1a);
  pfStack_2000 = (fdb_kvs_handle *)0x202066722d206d72;
  pfStack_22e8 = (fdb_kvs_handle *)0x1130c4;
  system((char *)&pfStack_2000);
  pfStack_22e8 = (fdb_kvs_handle *)0x1130c9;
  memleak_start();
  pfStack_22e8 = (fdb_kvs_handle *)0x1130d3;
  pfVar12 = (fdb_kvs_handle *)malloc(0x20);
  pfVar17 = (fdb_kvs_handle *)((long)apbStack_2200 + 0x108);
  pfStack_22e8 = (fdb_kvs_handle *)0x1130e6;
  fdb_get_default_config();
  uStack_20d8 = 0x201;
  auStack_20f8[0x18] = '\x01';
  auStack_20f8._16_8_ = (fdb_txn *)0x2;
  uStack_20b8 = 1;
  auStack_20f8._8_8_ = (fdb_log_callback)0x0;
  pcStack_20a0 = cb_inmem_snap;
  uStack_2098 = 2;
  pfStack_2090 = (fdb_txn *)auStack_2280;
  pfStack_22e8 = (fdb_kvs_handle *)0x113130;
  fdb_get_default_kvs_config();
  pfStack_22e8 = (fdb_kvs_handle *)0x113144;
  fVar5 = fdb_open(&pfStack_22d0,"./mvcc_test",(fdb_config *)pfVar17);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    in_RCX = auStack_2280 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x11316a;
    fVar5 = fdb_kvs_open(pfStack_22d0,(fdb_kvs_handle **)(auStack_22b0 + 0x10),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113549;
    in_RCX = auStack_2280 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x113190;
    fVar5 = fdb_kvs_open(pfStack_22d0,(fdb_kvs_handle **)(auStack_22b0 + 0x18),"db",
                         (fdb_kvs_config *)in_RCX);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011354e;
    auStack_2280._0_8_ = auStack_22b0._24_8_;
    auStack_2280._8_8_ = (btree *)0xa;
    auStack_2280._24_8_ = auStack_22d8;
    handle_00 = auStack_22b0;
    auStack_2280._16_4_ = 0x20;
    pfVar17 = (fdb_kvs_handle *)((long)&pfVar12->kvs + 2);
    pcVar21 = (char *)apbStack_2200;
    handle._M_i = 0;
    auStack_2280._32_8_ = handle_00;
    do {
      pfStack_22e8 = (fdb_kvs_handle *)0x1131ec;
      sprintf(pcVar21,auStack_22d8,handle._M_i);
      *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
      *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
      *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
      *(undefined4 *)&pfVar12->kvs = 0x78787878;
      *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
      *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
      *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
      pfStack_22e8 = (fdb_kvs_handle *)0x113217;
      sprintf((char *)pfVar12,handle_00,handle._M_i);
      unaff_R13 = (char *)auStack_22b0._16_8_;
      pfStack_22e8 = (fdb_kvs_handle *)0x113224;
      sVar8 = strlen(pcVar21);
      pfStack_22e8 = (fdb_kvs_handle *)0x11323c;
      in_RCX = (char *)pfVar12;
      fVar5 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,pcVar21,sVar8 + 1,pfVar12,0x20);
      if (fVar5 != FDB_RESULT_SUCCESS) {
        pfStack_22e8 = (fdb_kvs_handle *)0x11350e;
        in_memory_snapshot_compaction_test();
        goto LAB_0011350e;
      }
      uVar19 = (int)handle._M_i + 1;
      handle._M_i = (__int_type)uVar19;
    } while (uVar19 != 10);
    pfStack_22e8 = (fdb_kvs_handle *)0x11325a;
    fVar5 = fdb_commit(pfStack_22d0,'\x01');
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113553;
    pfStack_22e8 = (fdb_kvs_handle *)0x113273;
    fVar5 = fdb_compact(pfStack_22d0,"./mvcc_test2");
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113558;
    pfStack_22e8 = (fdb_kvs_handle *)0x113291;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_22b0._16_8_,&pfStack_22c0,0xffffffffffffffff
                             );
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011355d;
    pfStack_22e8 = (fdb_kvs_handle *)0x1132ab;
    fVar5 = fdb_get_kvs_info(pfStack_22c0,(fdb_kvs_info *)&phStack_2240);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113562;
    if (pkStack_2238 != (kvs_ops_stat *)0xb) {
      pfStack_22e8 = (fdb_kvs_handle *)0x1132cb;
      in_memory_snapshot_compaction_test();
    }
    in_RCX = (char *)0x0;
    pfStack_22e8 = (fdb_kvs_handle *)0x1132eb;
    fVar5 = fdb_iterator_init(pfStack_22c0,&pfStack_22b8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113567;
    handle_00 = (char *)apbStack_2200;
    handle._M_i = 0;
    do {
      pfStack_22c8 = (fdb_kvs_handle *)0x0;
      pfStack_22e8 = (fdb_kvs_handle *)0x113315;
      fVar5 = fdb_iterator_get(pfStack_22b8,(fdb_doc **)&pfStack_22c8);
      unaff_R13 = (char *)pfStack_22c8;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((uint)handle._M_i < 10) {
        pfStack_22e8 = (fdb_kvs_handle *)0x113333;
        sprintf(handle_00,auStack_22d8,handle._M_i);
        *(undefined4 *)&pfVar12->kvs_config = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).field_0x4 = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).custom_cmp = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = 0x78787878;
        *(undefined4 *)&(pfVar12->kvs_config).custom_cmp_param = 0x78787878;
        *(undefined4 *)((long)&(pfVar12->kvs_config).custom_cmp_param + 4) = 0x78787878;
        *(undefined4 *)&pfVar12->kvs = 0x78787878;
        *(uint32_t *)((long)&pfVar12->kvs + 4) = 0x78787878;
        *(undefined2 *)((long)&pfVar12->kvs + 6) = 0x3e;
        *(undefined4 *)&pfVar17->kvs_config = 0x646e653c;
        pfStack_22e8 = (fdb_kvs_handle *)0x113360;
        sprintf((char *)pfVar12,auStack_22b0,handle._M_i);
        unaff_R13 = (char *)pfStack_22c8;
        pcVar21 = (char *)pfStack_22c8->op_stats;
        pfStack_22e8 = (fdb_kvs_handle *)0x113378;
        iVar6 = bcmp(pcVar21,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_22c8->kvs_config);
        if (iVar6 != 0) goto LAB_00113529;
        pcVar21 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_22e8 = (fdb_kvs_handle *)0x113393;
        iVar6 = bcmp(pcVar21,pfVar12,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113539;
      }
      else {
        apbStack_2200[0] = (btreeblk_handle *)0x79656b5f77656e;
        *(fdb_kvs_handle **)&pfVar12->kvs_config = (fdb_kvs_handle *)0x756c61765f77656e;
        *(undefined2 *)&(pfVar12->kvs_config).custom_cmp = 0x65;
        pcVar21 = (char *)pfStack_22c8->op_stats;
        pfStack_22e8 = (fdb_kvs_handle *)0x1133d9;
        iVar6 = bcmp(pcVar21,handle_00,(size_t)*(fdb_kvs_handle **)&pfStack_22c8->kvs_config);
        if (iVar6 != 0) goto LAB_0011350e;
        pcVar21 = (char *)(((fdb_kvs_handle *)unaff_R13)->field_6).seqtree;
        pfStack_22e8 = (fdb_kvs_handle *)0x1133f4;
        iVar6 = bcmp(pcVar21,pfVar12,
                     (size_t)(((fdb_kvs_handle *)unaff_R13)->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011351e;
      }
      handle._M_i = (__int_type)((uint)handle._M_i + 1);
      pfStack_22e8 = (fdb_kvs_handle *)0x113408;
      fdb_doc_free((fdb_doc *)pfStack_22c8);
      pfStack_22e8 = (fdb_kvs_handle *)0x113412;
      fVar5 = fdb_iterator_next(pfStack_22b8);
      pfVar14 = (fdb_kvs_handle *)unaff_R13;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)handle._M_i != 0xb) goto LAB_0011356c;
    pfStack_22e8 = (fdb_kvs_handle *)0x11342d;
    fVar5 = fdb_iterator_close(pfStack_22b8);
    _Var13._M_i = (__int_type)pfStack_22c0;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113571;
    handle_00 = (char *)apbStack_2200;
    pfStack_22e8 = (fdb_kvs_handle *)0x11344a;
    sVar8 = strlen(handle_00);
    in_RCX = auStack_22b0 + 0x28;
    pfStack_22e8 = (fdb_kvs_handle *)0x113463;
    fVar5 = fdb_get_kv((fdb_kvs_handle *)_Var13._M_i,handle_00,sVar8 + 1,(void **)in_RCX,
                       (size_t *)(auStack_22b0 + 0x20));
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113576;
    pfStack_22e8 = (fdb_kvs_handle *)0x113480;
    _Var22._M_i = (__int_type)pfVar12;
    iVar6 = bcmp((void *)auStack_22b0._40_8_,pfVar12,auStack_22b0._32_8_);
    _Var13._M_i = auStack_22b0._40_8_;
    if (iVar6 != 0) goto LAB_0011357b;
    pfStack_22e8 = (fdb_kvs_handle *)0x113490;
    fdb_free_block((void *)auStack_22b0._40_8_);
    pfStack_22e8 = (fdb_kvs_handle *)0x11349a;
    fdb_kvs_close(pfStack_22c0);
    pfStack_22e8 = (fdb_kvs_handle *)0x1134a4;
    fVar5 = fdb_close(pfStack_22d0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113586;
    pfStack_22e8 = (fdb_kvs_handle *)0x1134b1;
    fVar5 = fdb_shutdown();
    if (fVar5 == FDB_RESULT_SUCCESS) {
      pfStack_22e8 = (fdb_kvs_handle *)0x1134c1;
      free(pfVar12);
      pfStack_22e8 = (fdb_kvs_handle *)0x1134c6;
      memleak_end();
      pcVar21 = "%s PASSED\n";
      if (in_memory_snapshot_compaction_test()::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_22e8 = (fdb_kvs_handle *)0x1134f7;
      fprintf(_stderr,pcVar21,"in-memory snapshot with concurrent compaction test");
      return;
    }
  }
  else {
LAB_00113544:
    pfStack_22e8 = (fdb_kvs_handle *)0x113549;
    in_memory_snapshot_compaction_test();
LAB_00113549:
    pfStack_22e8 = (fdb_kvs_handle *)0x11354e;
    in_memory_snapshot_compaction_test();
LAB_0011354e:
    pfStack_22e8 = (fdb_kvs_handle *)0x113553;
    in_memory_snapshot_compaction_test();
LAB_00113553:
    pfStack_22e8 = (fdb_kvs_handle *)0x113558;
    in_memory_snapshot_compaction_test();
LAB_00113558:
    pfStack_22e8 = (fdb_kvs_handle *)0x11355d;
    in_memory_snapshot_compaction_test();
LAB_0011355d:
    pfStack_22e8 = (fdb_kvs_handle *)0x113562;
    in_memory_snapshot_compaction_test();
LAB_00113562:
    pfStack_22e8 = (fdb_kvs_handle *)0x113567;
    in_memory_snapshot_compaction_test();
    pfVar14 = (fdb_kvs_handle *)unaff_R13;
LAB_00113567:
    pfStack_22e8 = (fdb_kvs_handle *)0x11356c;
    in_memory_snapshot_compaction_test();
LAB_0011356c:
    pfStack_22e8 = (fdb_kvs_handle *)0x113571;
    in_memory_snapshot_compaction_test();
LAB_00113571:
    _Var13._M_i = (__int_type)pfVar17;
    pfStack_22e8 = (fdb_kvs_handle *)0x113576;
    in_memory_snapshot_compaction_test();
LAB_00113576:
    pfStack_22e8 = (fdb_kvs_handle *)0x11357b;
    in_memory_snapshot_compaction_test();
LAB_0011357b:
    pfStack_22e8 = (fdb_kvs_handle *)0x113586;
    _Var22._M_i = _Var13._M_i;
    in_memory_snapshot_compaction_test();
LAB_00113586:
    pfStack_22e8 = (fdb_kvs_handle *)0x11358b;
    in_memory_snapshot_compaction_test();
  }
  pfStack_22e8 = (fdb_kvs_handle *)cb_inmem_snap;
  in_memory_snapshot_compaction_test();
  uVar24 = _Var22._M_i & 0xffffffff;
  pfVar17 = (fdb_kvs_handle *)0x0;
  pcStack_25a0 = (code *)0x1135b8;
  pfStack_2310 = pfVar12;
  pfStack_2308 = (fdb_kvs_handle *)pcVar21;
  pfStack_2300 = pfVar14;
  pfStack_22f8 = (fdb_kvs_handle *)_Var13._M_i;
  pfStack_22f0 = (fdb_kvs_handle *)handle_00;
  pfStack_22e8 = (fdb_kvs_handle *)handle._M_i;
  gettimeofday((timeval *)auStack_2528,(__timezone_ptr_t)0x0);
  if ((int)_Var22._M_i != 2) {
    return;
  }
  pfVar12 = extraout_RDX;
  if (extraout_RDX == (fdb_kvs_handle *)0x0) {
LAB_00113ad8:
    pcStack_25a0 = (code *)0x113add;
    cb_inmem_snap();
LAB_00113add:
    pcStack_25a0 = (code *)0x113ae2;
    cb_inmem_snap();
LAB_00113ae2:
    pcStack_25a0 = (code *)0x113ae7;
    cb_inmem_snap();
LAB_00113ae7:
    pcStack_25a0 = (code *)0x113aec;
    cb_inmem_snap();
LAB_00113aec:
    pcStack_25a0 = (code *)0x113af1;
    cb_inmem_snap();
LAB_00113af1:
    pcStack_25a0 = (code *)0x113af6;
    cb_inmem_snap();
LAB_00113af6:
    pcStack_25a0 = (code *)0x113afb;
    cb_inmem_snap();
    pfVar15 = pfVar12;
LAB_00113afb:
    pcStack_25a0 = (code *)0x113b00;
    cb_inmem_snap();
LAB_00113b00:
    pfVar12 = (fdb_kvs_handle *)in_RCX;
    pcStack_25a0 = (code *)0x113b05;
    cb_inmem_snap();
LAB_00113b05:
    pcStack_25a0 = (code *)0x113b0a;
    cb_inmem_snap();
  }
  else {
    pfVar12 = (fdb_kvs_handle *)
              CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_));
    pfVar17 = (fdb_kvs_handle *)(ulong)*(byte *)&((fdb_kvs_handle *)in_RCX)->file;
    iVar6 = *(int *)((long)&(pfVar12->kvs_config).custom_cmp + 4);
    *(int *)((long)&(pfVar12->kvs_config).custom_cmp + 4) = iVar6 + 1;
    if (iVar6 != 4) {
      if (iVar6 != 1) {
        return;
      }
      pcStack_25a0 = (code *)0x113607;
      fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar12->kvs_config,&pfStack_2580,
                                0xffffffffffffffff);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113add;
      pcStack_25a0 = (code *)0x11361e;
      fVar5 = fdb_get_kvs_info(pfStack_2580,&fStack_2558);
      if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113ae7;
      in_RCX = (char *)&(pfVar12->kvs_config).custom_cmp;
      if (fStack_2558.last_seqnum != (long)*(int *)&(pfVar12->kvs_config).custom_cmp) {
        pcStack_25a0 = (code *)0x113a46;
        cb_inmem_snap();
      }
      pcStack_25a0 = (code *)0x113663;
      pfStack_2578 = pfVar17;
      pp_Stack_2570 = (fdb_custom_cmp_variable *)in_RCX;
      fVar5 = fdb_iterator_init(pfStack_2580,&pfStack_2588,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar5 == FDB_RESULT_SUCCESS) {
        pfVar12 = (fdb_kvs_handle *)(auStack_2528 + 10);
        pcVar21 = auStack_251e + 6;
        uVar24 = 0;
        do {
          pfStack_2590 = (fdb_kvs_handle *)0x0;
          pcStack_25a0 = (code *)0x11369a;
          fVar5 = fdb_iterator_get(pfStack_2588,(fdb_doc **)&pfStack_2590);
          if (fVar5 != FDB_RESULT_SUCCESS) break;
          lVar18 = CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_));
          pcStack_25a0 = (code *)0x1136ba;
          sprintf((char *)afStack_2418,*(char **)(lVar18 + 0x18),uVar24);
          sVar8 = (size_t)*(int *)(lVar18 + 0x10);
          pcStack_25a0 = (code *)0x1136ce;
          memset(pcVar21,0x78,sVar8);
          *(undefined4 *)(&(pfVar12->kvs_config).create_if_missing + sVar8) = 0x646e653c;
          *(undefined2 *)(auStack_251e + sVar8 + 4) = 0x3e;
          pcStack_25a0 = (code *)0x1136ee;
          sprintf(pcVar21,*(char **)(lVar18 + 0x20),uVar24);
          pfVar14 = pfStack_2590;
          in_RCX = (char *)pfStack_2590->op_stats;
          pcStack_25a0 = (code *)0x113706;
          iVar6 = bcmp(in_RCX,afStack_2418,*(size_t *)&pfStack_2590->kvs_config);
          if (iVar6 != 0) {
            pcStack_25a0 = (code *)0x113a88;
            cb_inmem_snap();
LAB_00113a88:
            pcStack_25a0 = (code *)0x113a98;
            cb_inmem_snap();
            goto LAB_00113a98;
          }
          in_RCX = (char *)(pfVar14->field_6).seqtree;
          pcStack_25a0 = (code *)0x113721;
          iVar6 = bcmp(in_RCX,pcVar21,(size_t)(pfVar14->kvs_config).custom_cmp_param);
          if (iVar6 != 0) goto LAB_00113a88;
          uVar24 = (ulong)((int)uVar24 + 1);
          pcStack_25a0 = (code *)0x113733;
          fdb_doc_free((fdb_doc *)pfVar14);
          pcStack_25a0 = (code *)0x11373d;
          fVar5 = fdb_iterator_next(pfStack_2588);
        } while (fVar5 == FDB_RESULT_SUCCESS);
        if ((int)uVar24 != *(int *)pp_Stack_2570) {
          pcStack_25a0 = (code *)0x113a64;
          cb_inmem_snap();
        }
        pcStack_25a0 = (code *)0x11375c;
        fVar5 = fdb_iterator_close(pfStack_2588);
        pfVar17 = pfStack_2578;
        if (fVar5 == FDB_RESULT_SUCCESS) goto LAB_00113a19;
        pcStack_25a0 = (code *)0x11376e;
        cb_inmem_snap();
        goto LAB_0011376e;
      }
      goto LAB_00113af1;
    }
LAB_0011376e:
    pfStack_2578 = pfVar17;
    in_RCX = (char *)afStack_2418;
    afStack_2418[0].algorithm = 0x5f77656e;
    builtin_memcpy(&afStack_2418[0].algorithm,"key",4);
    pfVar14 = (fdb_kvs_handle *)(auStack_251e + 6);
    auStack_251e._6_8_ = 0x756c61765f77656e;
    uStack_2510 = 0x65;
    pfVar17 = *(fdb_kvs_handle **)&pfVar12->kvs_config;
    pcStack_25a0 = (code *)0x1137b0;
    sVar8 = strlen(in_RCX);
    pcVar21 = (char *)(sVar8 + 1);
    pcStack_25a0 = (code *)0x1137bc;
    sVar8 = strlen((char *)pfVar14);
    pcStack_25a0 = (code *)0x1137d1;
    fVar5 = fdb_set_kv(pfVar17,in_RCX,(size_t)pcVar21,pfVar14,sVar8 + 1);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113ae2;
    pcStack_25a0 = (code *)0x1137ed;
    fVar5 = fdb_snapshot_open(*(fdb_kvs_handle **)&pfVar12->kvs_config,&pfStack_2580,
                              0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113aec;
    pcStack_25a0 = (code *)0x113804;
    fVar5 = fdb_get_kvs_info(pfStack_2580,&fStack_2558);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113af6;
    in_RCX = (char *)&(pfVar12->kvs_config).custom_cmp;
    if (fStack_2558.last_seqnum != (long)*(int *)&(pfVar12->kvs_config).custom_cmp + 1U) {
      pcStack_25a0 = (code *)0x113a58;
      cb_inmem_snap();
    }
    pcStack_25a0 = (code *)0x113842;
    fVar5 = fdb_iterator_init(pfStack_2580,&pfStack_2588,(void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = pfVar12;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113afb;
    pcVar21 = auStack_251e + 6;
    uVar24 = 0;
    do {
      pfStack_2590 = (fdb_kvs_handle *)0x0;
      pcStack_25a0 = (code *)0x113874;
      fVar5 = fdb_iterator_get(pfStack_2588,(fdb_doc **)&pfStack_2590);
      pfVar12 = pfStack_2590;
      if (fVar5 != FDB_RESULT_SUCCESS) break;
      if ((int)uVar24 < *(int *)in_RCX) {
        lVar18 = CONCAT26(auStack_22d8._6_2_,CONCAT24(auStack_22d8._4_2_,auStack_22d8._0_4_));
        pcStack_25a0 = (code *)0x11389c;
        sprintf((char *)afStack_2418,*(char **)(lVar18 + 0x18),uVar24);
        sVar8 = (size_t)*(int *)(lVar18 + 0x10);
        pcStack_25a0 = (code *)0x1138b0;
        memset(pcVar21,0x78,sVar8);
        *(undefined4 *)(auStack_2528 + sVar8 + 10) = 0x646e653c;
        *(undefined2 *)(auStack_251e + sVar8 + 4) = 0x3e;
        pcStack_25a0 = (code *)0x1138d5;
        sprintf(pcVar21,*(char **)(lVar18 + 0x20),uVar24);
        pfVar12 = pfStack_2590;
        pfVar14 = (fdb_kvs_handle *)pfStack_2590->op_stats;
        pcStack_25a0 = (code *)0x1138ec;
        iVar6 = bcmp(pfVar14,afStack_2418,*(size_t *)&pfStack_2590->kvs_config);
        if (iVar6 != 0) goto LAB_00113aa8;
        pfVar14 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
        pcStack_25a0 = (code *)0x113907;
        iVar6 = bcmp(pfVar14,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113ab8;
      }
      else {
        afStack_2418[0].algorithm = 0x5f77656e;
        builtin_memcpy(&afStack_2418[0].algorithm,"key",4);
        auStack_251e._6_8_ = 0x756c61765f77656e;
        uStack_2510 = 0x65;
        pfVar14 = (fdb_kvs_handle *)pfStack_2590->op_stats;
        pcStack_25a0 = (code *)0x113955;
        iVar6 = bcmp(pfVar14,afStack_2418,*(size_t *)&pfStack_2590->kvs_config);
        if (iVar6 != 0) goto LAB_00113ac8;
        pfVar14 = (fdb_kvs_handle *)(pfVar12->field_6).seqtree;
        pcStack_25a0 = (code *)0x113970;
        iVar6 = bcmp(pfVar14,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_00113a98;
      }
      uVar24 = (ulong)((int)uVar24 + 1);
      pcStack_25a0 = (code *)0x113984;
      fdb_doc_free((fdb_doc *)pfStack_2590);
      pcStack_25a0 = (code *)0x11398e;
      fVar5 = fdb_iterator_next(pfStack_2588);
      pfVar15 = pfVar12;
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)uVar24 != *(int *)in_RCX + 1) {
      pcStack_25a0 = (code *)0x113a73;
      cb_inmem_snap();
    }
    pcStack_25a0 = (code *)0x1139ac;
    fVar5 = fdb_iterator_close(pfStack_2588);
    pfVar17 = pfStack_2578;
    pfVar12 = pfStack_2580;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113b00;
    pfVar15 = (fdb_kvs_handle *)afStack_2418;
    pcStack_25a0 = (code *)0x1139ce;
    sVar8 = strlen((char *)pfVar15);
    pcStack_25a0 = (code *)0x1139e7;
    fVar5 = fdb_get_kv(pfVar12,pfVar15,sVar8 + 1,&pfStack_2560,&sStack_2568);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00113b05;
    pcStack_25a0 = (code *)0x113a09;
    iVar6 = bcmp(pfStack_2560,auStack_251e + 6,sStack_2568);
    pfVar12 = pfStack_2560;
    if (iVar6 == 0) {
      pcStack_25a0 = (code *)0x113a19;
      fdb_free_block(pfStack_2560);
LAB_00113a19:
      pcStack_25a0 = (code *)0x113a23;
      fdb_kvs_close(pfStack_2580);
      return;
    }
  }
  pcStack_25a0 = snapshot_clone_test;
  cb_inmem_snap();
  pfStack_2b18 = (fdb_iterator *)0x113b3a;
  fStack_27c0.bub_ctx.space_used = (uint64_t)pfVar12;
  fStack_27c0.bub_ctx.handle = (fdb_kvs_handle *)pcVar21;
  pfStack_25b8 = pfVar14;
  pfStack_25b0 = pfVar15;
  pfStack_25a8 = pfVar17;
  pcStack_25a0 = (code *)uVar24;
  gettimeofday(&tStack_29e8,(__timezone_ptr_t)0x0);
  pfStack_2b18 = (fdb_iterator *)0x113b3f;
  memleak_start();
  pfStack_2b18 = (fdb_iterator *)0x113b4e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar12 = (fdb_kvs_handle *)&fStack_27c0.config.encryption_key;
  pfStack_2b18 = (fdb_iterator *)0x113b5e;
  fdb_get_default_config();
  config_00 = (fdb_iterator *)auStack_29d8;
  pfStack_2b18 = (fdb_iterator *)0x113b6e;
  fdb_get_default_kvs_config();
  fStack_27c0.config.encryption_key.bytes[4] = '\0';
  fStack_27c0.config.encryption_key.bytes[5] = '\0';
  fStack_27c0.config.encryption_key.bytes[6] = '\0';
  fStack_27c0.config.encryption_key.bytes[7] = '\0';
  fStack_27c0.config.encryption_key.bytes[8] = '\0';
  fStack_27c0.config.encryption_key.bytes[9] = '\0';
  fStack_27c0.config.encryption_key.bytes[10] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xb] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xc] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xd] = '\x04';
  fStack_27c0.config.encryption_key.bytes[0xe] = '\0';
  fStack_27c0.config.encryption_key.bytes[0xf] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x10] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x11] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x12] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x13] = '\0';
  fStack_27c0.config.encryption_key.bytes[0x1c] = '\x01';
  fStack_27c0.config._180_4_ = 1;
  fStack_27c0.config.block_reusing_threshold._7_1_ = 0;
  pfStack_2b18 = (fdb_iterator *)0x113b98;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pfVar17 = (fdb_kvs_handle *)(auStack_2af8 + 0x10);
  pfStack_2b18 = (fdb_iterator *)0x113baf;
  fVar5 = fdb_open((fdb_file_handle **)pfVar17,"./mvcc_test1",(fdb_config *)pfVar12);
  doc_00 = (fdb_iterator *)(ulong)(uint)fVar5;
  pfStack_2b18 = (fdb_iterator *)0x113bc1;
  fdb_kvs_open_default
            ((fdb_file_handle *)auStack_2af8._16_8_,&pfStack_2b08,(fdb_kvs_config *)config_00);
  if (fVar5 == FDB_RESULT_SUCCESS) {
    pfStack_2b18 = (fdb_iterator *)0x113bda;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),0);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00114595;
    pfStack_2b18 = (fdb_iterator *)0x113bf4;
    fdb_get_kvs_info((fdb_kvs_handle *)auStack_2af8._8_8_,(fdb_kvs_info *)(apfStack_2a48 + 6));
    if ((fdb_kvs_handle *)fStack_2a18.last_seqnum != (fdb_kvs_handle *)0x0) {
      pfStack_2b18 = (fdb_iterator *)0x113c07;
      snapshot_clone_test();
    }
    pfVar17 = (fdb_kvs_handle *)auStack_2af8;
    pfStack_2b18 = (fdb_iterator *)0x113c2a;
    fdb_iterator_init((fdb_kvs_handle *)auStack_2af8._8_8_,(fdb_iterator **)pfVar17,(void *)0x0,0,
                      (void *)0x0,0,0);
    pfStack_2b18 = (fdb_iterator *)0x113c32;
    fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
    pfVar15 = (fdb_kvs_handle *)pcVar21;
    if (fVar5 != FDB_RESULT_ITERATOR_FAIL) goto LAB_0011459a;
    pfStack_2b18 = (fdb_iterator *)0x113c45;
    fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
    pfStack_2b18 = (fdb_iterator *)0x113c4f;
    fdb_kvs_close((fdb_kvs_handle *)auStack_2af8._8_8_);
    lVar18 = 0;
    uVar24 = 0;
    do {
      pfStack_2b18 = (fdb_iterator *)0x113c71;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113c8d;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113ca9;
      sprintf((char *)&fStack_27c0,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113cb9;
      sVar8 = strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x113cc4;
      sVar9 = strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x113ccf;
      sVar10 = strlen((char *)&fStack_27c0);
      pfStack_2b18 = (fdb_iterator *)0x113cf4;
      fdb_doc_create((fdb_doc **)(auStack_2ac0 + lVar18),auStack_29d8 + 0x18,sVar8,&fStack_28c0,
                     sVar9,&fStack_27c0,sVar10);
      pfStack_2b18 = (fdb_iterator *)0x113d03;
      fdb_set(pfStack_2b08,*(fdb_doc **)(auStack_2ac0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      lVar18 = lVar18 + 8;
    } while (uVar24 != 5);
    pfStack_2b18 = (fdb_iterator *)0x113d23;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\x01');
    uVar24 = 5;
    ppfVar26 = (fdb_doc **)(auStack_2ac0 + 0x28);
    do {
      pfStack_2b18 = (fdb_iterator *)0x113d4a;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113d66;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113d82;
      sprintf((char *)&fStack_27c0,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113d8a;
      sVar8 = strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x113d95;
      sVar9 = strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x113da0;
      sVar10 = strlen((char *)&fStack_27c0);
      pfStack_2b18 = (fdb_iterator *)0x113dc0;
      fdb_doc_create(ppfVar26,auStack_29d8 + 0x18,sVar8,&fStack_28c0,sVar9,&fStack_27c0,sVar10);
      pfStack_2b18 = (fdb_iterator *)0x113dcd;
      fdb_set(pfStack_2b08,*ppfVar26);
      uVar24 = uVar24 + 1;
      ppfVar26 = ppfVar26 + 1;
    } while (uVar24 != 9);
    pfVar12 = (fdb_kvs_handle *)(auStack_29d8 + 0x18);
    pfStack_2b18 = (fdb_iterator *)0x113dfc;
    sprintf((char *)pfVar12,"key%d",9);
    config_00 = &fStack_28c0;
    pfStack_2b18 = (fdb_iterator *)0x113e1a;
    sprintf((char *)config_00,"meta%d",9);
    pfVar15 = &fStack_27c0;
    pfStack_2b18 = (fdb_iterator *)0x113e38;
    sprintf((char *)pfVar15,"Body%d",9);
    pfVar17 = (fdb_kvs_handle *)(auStack_2ac0 + 0x48);
    pfStack_2b18 = (fdb_iterator *)0x113e48;
    pfVar14 = (fdb_kvs_handle *)strlen((char *)pfVar12);
    pfStack_2b18 = (fdb_iterator *)0x113e53;
    doc_00 = (fdb_iterator *)strlen((char *)config_00);
    pfStack_2b18 = (fdb_iterator *)0x113e5e;
    sVar8 = strlen((char *)pfVar15);
    pfStack_2b18 = (fdb_iterator *)0x113e79;
    fdb_doc_create((fdb_doc **)pfVar17,pfVar12,(size_t)pfVar14,config_00,(size_t)doc_00,pfVar15,
                   sVar8);
    pfStack_2b18 = (fdb_iterator *)0x113e86;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x113e92;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    **(undefined1 **)(auStack_2ac0._72_8_ + 0x40) = 0x62;
    pfStack_2b18 = (fdb_iterator *)0x113ea9;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x113eb5;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    pfStack_2ad8 = *(fdb_kvs_handle **)(auStack_2ac0._72_8_ + 0x28);
    pfStack_2b18 = (fdb_iterator *)0x113ed7;
    fVar5 = fdb_snapshot_open(pfStack_2b08,&pfStack_2ac8,0xffffffffffffffff);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_0011459f;
    pfStack_2b18 = (fdb_iterator *)0x113ef1;
    fdb_set(pfStack_2b08,(fdb_doc *)auStack_2ac0._72_8_);
    pfStack_2b18 = (fdb_iterator *)0x113efd;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    uVar24 = 10;
    pfVar17 = (fdb_kvs_handle *)0x50;
    do {
      pfStack_2b18 = (fdb_iterator *)0x113f24;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x113f40;
      sprintf((char *)&fStack_28c0,"meta%d",uVar24 & 0xffffffff);
      pfVar15 = &fStack_27c0;
      pfStack_2b18 = (fdb_iterator *)0x113f5c;
      sprintf((char *)pfVar15,"body%d",uVar24 & 0xffffffff);
      doc_00 = (fdb_iterator *)(auStack_2ac0 + (long)pfVar17);
      pfStack_2b18 = (fdb_iterator *)0x113f6c;
      pfVar12 = (fdb_kvs_handle *)strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x113f77;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)&fStack_28c0);
      pfStack_2b18 = (fdb_iterator *)0x113f82;
      sVar8 = strlen((char *)pfVar15);
      pfStack_2b18 = (fdb_iterator *)0x113fa7;
      fdb_doc_create((fdb_doc **)doc_00,auStack_29d8 + 0x18,(size_t)pfVar12,&fStack_28c0,
                     (size_t)pfVar14,pfVar15,sVar8);
      pfStack_2b18 = (fdb_iterator *)0x113fb6;
      fdb_set(pfStack_2b08,*(fdb_doc **)(auStack_2ac0 + uVar24 * 8));
      uVar24 = uVar24 + 1;
      pfVar17 = (fdb_kvs_handle *)((long)pfVar17 + 8);
    } while (uVar24 != 0xf);
    pfStack_2b18 = (fdb_iterator *)0x113fd6;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\x01');
    pfStack_2b18 = (fdb_iterator *)0x113fee;
    fVar5 = fdb_set_log_callback(pfStack_2b08,logCallbackFunc,"snapshot_clone_test");
    config_00 = (fdb_iterator *)0xf;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145a4;
    pfStack_2b18 = (fdb_iterator *)0x11400a;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),999999);
    pfVar12 = pfStack_2ad8;
    if (fVar5 != FDB_RESULT_NO_DB_INSTANCE) goto LAB_001145a9;
    pfStack_2b18 = (fdb_iterator *)0x11402a;
    fVar5 = fdb_snapshot_open(pfStack_2b08,(fdb_kvs_handle **)(auStack_2af8 + 8),
                              (fdb_seqnum_t)pfStack_2ad8);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145ae;
    pfStack_2b18 = (fdb_iterator *)0x114044;
    fVar5 = fdb_snapshot_open((fdb_kvs_handle *)auStack_2af8._8_8_,&pfStack_2ae0,
                              (fdb_seqnum_t)pfVar12);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145b3;
    pfStack_2b18 = (fdb_iterator *)0x114056;
    fVar5 = fdb_kvs_close((fdb_kvs_handle *)auStack_2af8._8_8_);
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145b8;
    pfStack_2b18 = (fdb_iterator *)0x114073;
    fdb_get_kvs_info(pfStack_2ae0,(fdb_kvs_info *)(apfStack_2a48 + 6));
    if ((fdb_kvs_handle *)fStack_2a18.last_seqnum != pfVar12) {
      pfStack_2b18 = (fdb_iterator *)0x114089;
      snapshot_clone_test();
    }
    uVar24 = 0xf;
    config_00 = (fdb_iterator *)apfStack_2a48;
    do {
      pfStack_2b18 = (fdb_iterator *)0x1140b1;
      sprintf(auStack_29d8 + 0x18,"key%d",uVar24 & 0xffffffff);
      doc_00 = &fStack_28c0;
      pfStack_2b18 = (fdb_iterator *)0x1140cc;
      sprintf((char *)doc_00,"meta%d",uVar24 & 0xffffffff);
      pfVar12 = &fStack_27c0;
      pfStack_2b18 = (fdb_iterator *)0x1140e7;
      sprintf((char *)pfVar12,"body%d",uVar24 & 0xffffffff);
      pfStack_2b18 = (fdb_iterator *)0x1140ef;
      pfVar15 = (fdb_kvs_handle *)strlen(auStack_29d8 + 0x18);
      pfStack_2b18 = (fdb_iterator *)0x1140fa;
      pfVar14 = (fdb_kvs_handle *)strlen((char *)doc_00);
      pfStack_2b18 = (fdb_iterator *)0x114105;
      sVar8 = strlen((char *)pfVar12);
      pfStack_2b18 = (fdb_iterator *)0x114125;
      fdb_doc_create((fdb_doc **)config_00,auStack_29d8 + 0x18,(size_t)pfVar15,doc_00,
                     (size_t)pfVar14,pfVar12,sVar8);
      pfStack_2b18 = (fdb_iterator *)0x114132;
      fdb_set(pfStack_2b08,*(fdb_doc **)config_00);
      uVar24 = uVar24 + 1;
      config_00 = (fdb_iterator *)((long)config_00 + 8);
    } while (uVar24 != 0x14);
    pfStack_2b18 = (fdb_iterator *)0x11414f;
    fdb_commit((fdb_file_handle *)auStack_2af8._16_8_,'\0');
    pfStack_2b18 = (fdb_iterator *)0x114165;
    fVar5 = fdb_snapshot_open(pfStack_2ac8,&pfStack_2ad0,0xffffffffffffffff);
    pfVar17 = (fdb_kvs_handle *)0x14;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145bd;
    pfVar17 = (fdb_kvs_handle *)&pfStack_2b00;
    pfStack_2b18 = (fdb_iterator *)0x1141b0;
    fdb_doc_create((fdb_doc **)pfVar17,
                   (void *)(*(size_t **)
                             (auStack_2ac0 + (((long)pfStack_2ad8 << 0x20) + 0x100000000 >> 0x1d)))
                           [4],
                   **(size_t **)
                     (auStack_2ac0 + (((long)pfStack_2ad8 << 0x20) + 0x100000000 >> 0x1d)),
                   (void *)0x0,0,(void *)0x0,0);
    pfStack_2b18 = (fdb_iterator *)0x1141bd;
    fVar5 = fdb_get_metaonly(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    if (fVar5 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_001145c2;
    pfStack_2b18 = (fdb_iterator *)0x1141d3;
    fdb_doc_free((fdb_doc *)pfStack_2b00);
    pfStack_2b18 = (fdb_iterator *)0x1141f7;
    fdb_doc_create((fdb_doc **)&pfStack_2b00,*(kvs_ops_stat **)(auStack_2ac0._40_8_ + 0x20),
                   (size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_2ac0._40_8_,(void *)0x0,0,
                   (void *)0x0,0);
    pfStack_2b18 = (fdb_iterator *)0x114204;
    fVar5 = fdb_get_metaonly(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    pcVar21 = (char *)auStack_2ac0._40_8_;
    doc_01 = pfStack_2b00;
    pfVar17 = (fdb_kvs_handle *)&pfStack_2b00;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145c7;
    pfVar12 = (fdb_kvs_handle *)pfStack_2b00->op_stats;
    config_00 = *(fdb_iterator **)(auStack_2ac0._40_8_ + 0x20);
    pfStack_2b18 = (fdb_iterator *)0x11422e;
    iVar6 = bcmp(pfVar12,config_00,(size_t)*(fdb_kvs_handle **)(fdb_kvs_config *)auStack_2ac0._40_8_
                );
    if (iVar6 != 0) goto LAB_001145cc;
    pfVar12 = (fdb_kvs_handle *)doc_01->staletree;
    config_00 = *(fdb_iterator **)((long)pcVar21 + 0x38);
    pfStack_2b18 = (fdb_iterator *)0x11424f;
    iVar6 = bcmp(pfVar12,config_00,(size_t)((fdb_kvs_config *)pcVar21)->custom_cmp);
    if (iVar6 != 0) goto LAB_001145d7;
    pfStack_2b18 = (fdb_iterator *)0x11425f;
    fdb_doc_free((fdb_doc *)doc_01);
    pfStack_2b18 = (fdb_iterator *)0x114280;
    fdb_doc_create((fdb_doc **)&pfStack_2b00,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    pfStack_2b00->fhandle = (fdb_file_handle *)0x6;
    pfStack_2b18 = (fdb_iterator *)0x114295;
    fVar5 = fdb_get_byseq(pfStack_2ae0,(fdb_doc *)pfStack_2b00);
    pfVar17 = pfStack_2b00;
    doc_01 = (fdb_kvs_handle *)&pfStack_2b00;
    if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_001145e2;
    pfVar12 = (fdb_kvs_handle *)pfStack_2b00->op_stats;
    config_00 = *(fdb_iterator **)(auStack_2ac0._40_8_ + 0x20);
    pfStack_2b18 = (fdb_iterator *)0x1142be;
    iVar6 = bcmp(pfVar12,config_00,*(size_t *)&pfStack_2b00->kvs_config);
    pcVar21 = (char *)auStack_2ac0._40_8_;
    if (iVar6 != 0) goto LAB_001145e7;
    pfVar12 = (fdb_kvs_handle *)(pfVar17->field_6).seqtree;
    config_00 = (fdb_iterator *)
                ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(auStack_2ac0._40_8_ + 0x40))->
                seqtree;
    pfStack_2b18 = (fdb_iterator *)0x1142de;
    iVar6 = bcmp(pfVar12,config_00,(size_t)(pfVar17->kvs_config).custom_cmp_param);
    if (iVar6 != 0) goto LAB_001145f2;
    pfStack_2b18 = (fdb_iterator *)0x1142ee;
    fdb_doc_free((fdb_doc *)pfVar17);
    pfVar17 = (fdb_kvs_handle *)&pfStack_2b00;
    pfStack_2b00 = (fdb_kvs_handle *)0x0;
    pfVar14 = (fdb_kvs_handle *)0x0;
    pfStack_2b18 = (fdb_iterator *)0x11431d;
    fdb_iterator_init(pfStack_2ae0,(fdb_iterator **)auStack_2af8,(void *)0x0,0,(void *)0x0,0,0);
    pfVar15 = pfVar12;
    do {
      pfStack_2b18 = (fdb_iterator *)0x11432a;
      fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2af8._0_8_,(fdb_doc **)pfVar17);
      pfVar12 = pfStack_2b00;
      if (fVar5 != FDB_RESULT_SUCCESS) {
LAB_0011454f:
        pfStack_2b18 = (fdb_iterator *)0x114554;
        snapshot_clone_test();
        pfVar12 = pfVar15;
LAB_00114554:
        pfStack_2b18 = (fdb_iterator *)0x11455f;
        snapshot_clone_test();
LAB_0011455f:
        pfStack_2b18 = (fdb_iterator *)0x11456a;
        snapshot_clone_test();
        goto LAB_0011456a;
      }
      config_00 = (fdb_iterator *)pfStack_2b00->op_stats;
      doc_00 = *(fdb_iterator **)(auStack_2ac0 + (long)pfVar14 * 8);
      pcVar21 = (char *)doc_00->_seqnum;
      pfStack_2b18 = (fdb_iterator *)0x114352;
      iVar6 = bcmp(config_00,pcVar21,*(size_t *)&pfStack_2b00->kvs_config);
      pfVar15 = pfVar12;
      if (iVar6 != 0) {
        pfStack_2b18 = (fdb_iterator *)0x11454f;
        snapshot_clone_test();
        goto LAB_0011454f;
      }
      config_00 = (fdb_iterator *)pfVar12->staletree;
      pcVar21 = (char *)doc_00->tree_cursor_start;
      pfStack_2b18 = (fdb_iterator *)0x114371;
      iVar6 = bcmp(config_00,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp);
      if (iVar6 != 0) goto LAB_0011455f;
      config_00 = (fdb_iterator *)(pfVar12->field_6).seqtree;
      pcVar21 = (char *)doc_00->tree_cursor_prev;
      pfStack_2b18 = (fdb_iterator *)0x114390;
      iVar6 = bcmp(config_00,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp_param);
      if (iVar6 != 0) goto LAB_00114554;
      pfStack_2b18 = (fdb_iterator *)0x1143a0;
      fdb_doc_free((fdb_doc *)pfVar12);
      pfStack_2b00 = (fdb_kvs_handle *)0x0;
      pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
      pfStack_2b18 = (fdb_iterator *)0x1143b6;
      pfVar23 = (fdb_iterator *)auStack_2af8._0_8_;
      fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
    } while (fVar5 == FDB_RESULT_SUCCESS);
    if ((int)pfVar14 == 10) {
      pfStack_2b18 = (fdb_iterator *)0x1143d5;
      fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
      pfVar14 = (fdb_kvs_handle *)0x0;
      pfStack_2b18 = (fdb_iterator *)0x1143f6;
      fdb_iterator_init(pfStack_2ad0,(fdb_iterator **)auStack_2af8,(void *)0x0,0,(void *)0x0,0,0);
      pfVar17 = (fdb_kvs_handle *)&pfStack_2b00;
      do {
        pfStack_2b18 = (fdb_iterator *)0x114408;
        fVar5 = fdb_iterator_get((fdb_iterator *)auStack_2af8._0_8_,(fdb_doc **)pfVar17);
        pfVar12 = pfStack_2b00;
        if (fVar5 != FDB_RESULT_SUCCESS) goto LAB_00114575;
        config_00 = (fdb_iterator *)pfStack_2b00->op_stats;
        doc_00 = *(fdb_iterator **)(auStack_2ac0 + (long)pfVar14 * 8);
        pcVar21 = (char *)doc_00->_seqnum;
        pfStack_2b18 = (fdb_iterator *)0x114430;
        iVar6 = bcmp(config_00,pcVar21,*(size_t *)&pfStack_2b00->kvs_config);
        if (iVar6 != 0) goto LAB_0011456a;
        config_00 = (fdb_iterator *)pfVar12->staletree;
        pcVar21 = (char *)doc_00->tree_cursor_start;
        pfStack_2b18 = (fdb_iterator *)0x11444f;
        iVar6 = bcmp(config_00,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp);
        if (iVar6 != 0) goto LAB_00114585;
        config_00 = (fdb_iterator *)(pfVar12->field_6).seqtree;
        pcVar21 = (char *)doc_00->tree_cursor_prev;
        pfStack_2b18 = (fdb_iterator *)0x11446e;
        iVar6 = bcmp(config_00,pcVar21,(size_t)(pfVar12->kvs_config).custom_cmp_param);
        if (iVar6 != 0) goto LAB_0011457a;
        pfStack_2b18 = (fdb_iterator *)0x11447e;
        fdb_doc_free((fdb_doc *)pfVar12);
        pfStack_2b00 = (fdb_kvs_handle *)0x0;
        pfVar14 = (fdb_kvs_handle *)&(pfVar14->kvs_config).field_0x1;
        pfStack_2b18 = (fdb_iterator *)0x114494;
        pfVar23 = (fdb_iterator *)auStack_2af8._0_8_;
        fVar5 = fdb_iterator_next((fdb_iterator *)auStack_2af8._0_8_);
        pfVar15 = pfVar12;
      } while (fVar5 == FDB_RESULT_SUCCESS);
      if ((int)pfVar14 == 10) {
        pfStack_2b18 = (fdb_iterator *)0x1144b0;
        fdb_iterator_close((fdb_iterator *)auStack_2af8._0_8_);
        pfStack_2b18 = (fdb_iterator *)0x1144ba;
        fdb_kvs_close(pfStack_2b08);
        pfStack_2b18 = (fdb_iterator *)0x1144c4;
        fdb_kvs_close(pfStack_2ac8);
        pfStack_2b18 = (fdb_iterator *)0x1144ce;
        fdb_kvs_close(pfStack_2ad0);
        pfStack_2b18 = (fdb_iterator *)0x1144d8;
        fdb_kvs_close(pfStack_2ae0);
        pfStack_2b18 = (fdb_iterator *)0x1144e2;
        fdb_close((fdb_file_handle *)auStack_2af8._16_8_);
        lVar18 = 0;
        do {
          pfStack_2b18 = (fdb_iterator *)0x1144ee;
          fdb_doc_free(*(fdb_doc **)(auStack_2ac0 + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while (lVar18 != 0x14);
        pfStack_2b18 = (fdb_iterator *)0x1144fc;
        fdb_shutdown();
        pfStack_2b18 = (fdb_iterator *)0x114501;
        memleak_end();
        pcVar21 = "%s PASSED\n";
        if (snapshot_clone_test()::__test_pass != '\0') {
          pcVar21 = "%s FAILED\n";
        }
        pfStack_2b18 = (fdb_iterator *)0x114532;
        fprintf(_stderr,pcVar21,"snapshot clone test");
        return;
      }
      goto LAB_00114602;
    }
  }
  else {
LAB_00114590:
    pfStack_2b18 = (fdb_iterator *)0x114595;
    snapshot_clone_test();
LAB_00114595:
    pfStack_2b18 = (fdb_iterator *)0x11459a;
    snapshot_clone_test();
    pfVar15 = (fdb_kvs_handle *)pcVar21;
LAB_0011459a:
    pfStack_2b18 = (fdb_iterator *)0x11459f;
    snapshot_clone_test();
LAB_0011459f:
    pfStack_2b18 = (fdb_iterator *)0x1145a4;
    snapshot_clone_test();
LAB_001145a4:
    pfStack_2b18 = (fdb_iterator *)0x1145a9;
    snapshot_clone_test();
LAB_001145a9:
    pfStack_2b18 = (fdb_iterator *)0x1145ae;
    snapshot_clone_test();
LAB_001145ae:
    pfStack_2b18 = (fdb_iterator *)0x1145b3;
    snapshot_clone_test();
LAB_001145b3:
    pfStack_2b18 = (fdb_iterator *)0x1145b8;
    snapshot_clone_test();
LAB_001145b8:
    pfStack_2b18 = (fdb_iterator *)0x1145bd;
    snapshot_clone_test();
LAB_001145bd:
    pfStack_2b18 = (fdb_iterator *)0x1145c2;
    snapshot_clone_test();
LAB_001145c2:
    pfStack_2b18 = (fdb_iterator *)0x1145c7;
    snapshot_clone_test();
LAB_001145c7:
    pcVar21 = (char *)pfVar15;
    doc_01 = pfVar17;
    pfStack_2b18 = (fdb_iterator *)0x1145cc;
    snapshot_clone_test();
LAB_001145cc:
    pfStack_2b18 = (fdb_iterator *)0x1145d7;
    snapshot_clone_test();
LAB_001145d7:
    pfStack_2b18 = (fdb_iterator *)0x1145e2;
    snapshot_clone_test();
LAB_001145e2:
    pfVar17 = doc_01;
    pfStack_2b18 = (fdb_iterator *)0x1145e7;
    snapshot_clone_test();
LAB_001145e7:
    pfStack_2b18 = (fdb_iterator *)0x1145f2;
    snapshot_clone_test();
LAB_001145f2:
    pfStack_2b18 = (fdb_iterator *)0x1145fd;
    pfVar23 = config_00;
    snapshot_clone_test();
  }
  pfStack_2b18 = (fdb_iterator *)0x114602;
  snapshot_clone_test();
LAB_00114602:
  pfStack_2b18 = (fdb_iterator *)snap_clone_thread;
  snapshot_clone_test();
  pfStack_2b70 = (fdb_doc *)0x0;
  lVar18 = (((atomic<unsigned_long> *)&pfVar23->handle)->super___atomic_base<unsigned_long>)._M_i;
  iVar6 = *(int *)&(((atomic<unsigned_long> *)&pfVar23->seqtree_iterator)->
                   super___atomic_base<unsigned_long>)._M_i;
  pfStack_2b40 = pfVar17;
  pfStack_2b38 = (fdb_kvs_handle *)pcVar21;
  pfStack_2b30 = pfVar14;
  pfStack_2b28 = pfVar12;
  pfStack_2b20 = config_00;
  pfStack_2b18 = doc_00;
  gettimeofday(&tStack_2b50,(__timezone_ptr_t)0x0);
  fVar5 = fdb_snapshot_open((fdb_kvs_handle *)
                            (((atomic<unsigned_long> *)&pfVar23->hbtrie_iterator)->
                            super___atomic_base<unsigned_long>)._M_i,&pfStack_2b58,
                            0xffffffffffffffff);
  if (fVar5 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x7d5);
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x7d5,"void *snap_clone_thread(void *)");
  }
  lVar20 = 0;
  iStack_2b5c = iVar6;
  fdb_iterator_init(pfStack_2b58,&pfStack_2b68,(void *)0x0,0,(void *)0x0,0,0);
  do {
    fVar5 = fdb_iterator_get(pfStack_2b68,&pfStack_2b70);
    pfVar25 = pfStack_2b70;
    if (fVar5 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7df);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7df,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfStack_2b70->key;
    lVar2 = *(long *)(lVar18 + lVar20 * 8);
    pvVar3 = *(void **)(lVar2 + 0x20);
    iVar6 = bcmp(pvVar1,pvVar3,pfStack_2b70->keylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e0);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e0,"void *snap_clone_thread(void *)");
    }
    pvVar1 = pfVar25->body;
    pvVar3 = *(void **)(lVar2 + 0x40);
    iVar6 = bcmp(pvVar1,pvVar3,pfVar25->bodylen);
    if (iVar6 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pvVar3,pvVar1,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x7e1);
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x7e1,"void *snap_clone_thread(void *)");
    }
    fdb_doc_free(pfVar25);
    pfStack_2b70 = (fdb_doc *)0x0;
    lVar20 = lVar20 + 1;
    fVar5 = fdb_iterator_next(pfStack_2b68);
  } while (fVar5 == FDB_RESULT_SUCCESS);
  if (iStack_2b5c / 2 == (int)lVar20) {
    fdb_iterator_close(pfStack_2b68);
    fdb_kvs_close(pfStack_2b58);
    pthread_exit((void *)0x0);
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x7e9);
  __assert_fail("count==n/2",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x7e9,"void *snap_clone_thread(void *)");
}

Assistant:

void crash_recovery_test(bool walflush)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.seqtree_opt = FDB_SEQTREE_USE; // enable seqtree since get_byseq
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;

    // reopen db
    fdb_open(&dbfile, test_file, &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert documents
    for (i=0;i<n;++i){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }

    // commit
    if(walflush){
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(dbfile, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / fconfig.blocksize;

    // close the db
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // Shutdown forest db in the middle of the test to simulate crash
    fdb_shutdown();

    // append 9K of non-block aligned garbage at end of file
    r = _disk_dump(test_file, bid * fconfig.blocksize,
                   (2 * fconfig.blocksize) + (fconfig.blocksize / 4));
    TEST_CHK(r >= 0);

    // reopen the same file
    status = fdb_open(&dbfile, test_file, &fconfig);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_kvs_open_default(dbfile, &db, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "crash_recovery_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // retrieve documents
    for (i=0;i<n;++i){
        // search by key
        fdb_doc_create(&rdoc, doc[i]->key, doc[i]->keylen, NULL, 0, NULL, 0);
        status = fdb_get(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        // free result document
        fdb_doc_free(rdoc);
    }

    // retrieve documents by sequence number
    for (i=0;i<n;++i){
        // search by seq
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->seqnum = i + 1;
        status = fdb_get_byseq(db, rdoc);

        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // free result document
        fdb_doc_free(rdoc);
    }

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all resources
    fdb_shutdown();

    memleak_end();

    if(walflush){
        TEST_RESULT("crash recovery test - walflush");
    } else {
        TEST_RESULT("crash recovery test - normal flush");
    }
}